

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::BSplineCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Primitive PVar13;
  undefined4 uVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined3 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined6 uVar33;
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  byte bVar56;
  ulong uVar57;
  ulong uVar58;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar59;
  ulong uVar60;
  int iVar61;
  RTCIntersectArguments *pRVar62;
  RTCIntersectArguments *pRVar63;
  ulong uVar64;
  undefined1 auVar65 [8];
  long lVar66;
  bool bVar67;
  uint uVar68;
  uint uVar69;
  int iVar70;
  uint uVar71;
  uint uVar72;
  short sVar73;
  float t1;
  undefined2 uVar102;
  float fVar74;
  float fVar103;
  float fVar104;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar105;
  float fVar124;
  float fVar125;
  undefined1 auVar106 [16];
  undefined1 auVar109 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar126;
  float fVar143;
  float fVar144;
  vfloat4 v;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar145;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar146;
  float fVar147;
  float fVar163;
  float fVar165;
  vfloat4 v_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  float fVar164;
  float fVar166;
  float fVar167;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  float fVar168;
  float fVar171;
  float fVar172;
  vfloat4 a;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar177;
  float fVar200;
  float fVar201;
  vfloat_impl<4> p00;
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar202;
  float fVar212;
  float fVar213;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar214;
  float fVar215;
  float fVar224;
  float fVar226;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  float fVar225;
  float fVar227;
  float fVar228;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar229;
  float fVar239;
  float fVar240;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar254;
  float fVar257;
  undefined1 auVar244 [16];
  undefined1 auVar247 [16];
  float fVar255;
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar274;
  float fVar278;
  vfloat4 a_1;
  undefined1 auVar266 [16];
  undefined1 auVar269 [16];
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  float fVar285;
  float fVar294;
  float fVar295;
  vfloat4 a_3;
  float fVar297;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar290 [16];
  float fVar296;
  float fVar298;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar299;
  float fVar300;
  float fVar309;
  float fVar311;
  float fVar313;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar305 [16];
  float fVar310;
  float fVar312;
  float fVar314;
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar315;
  float fVar316;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined8 local_428;
  float fStack_410;
  float fStack_40c;
  undefined8 local_408;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3cc;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  ulong local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  Primitive *local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint auStack_1f8 [4];
  undefined8 local_1e8;
  float local_1e0;
  float local_1dc;
  float fStack_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  undefined8 auStack_58 [5];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 uVar101;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar161 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  
  PVar13 = prim[1];
  uVar57 = (ulong)(byte)PVar13;
  lVar20 = uVar57 * 0x25;
  pPVar4 = prim + lVar20 + 6;
  fVar144 = *(float *)(pPVar4 + 0xc);
  fVar146 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar4) * fVar144;
  fVar163 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar4 + 4)) * fVar144;
  fVar165 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar4 + 8)) * fVar144;
  fVar126 = fVar144 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar143 = fVar144 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar144 = fVar144 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar14 = *(undefined4 *)(prim + uVar57 * 4 + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar58;
  auVar119._12_2_ = uVar102;
  auVar119._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar128._12_4_ = auVar119._12_4_;
  auVar128._8_2_ = 0;
  auVar128._0_8_ = uVar58;
  auVar128._10_2_ = uVar102;
  auVar75._10_6_ = auVar128._10_6_;
  auVar75._8_2_ = uVar102;
  auVar75._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar34._4_8_ = auVar75._8_8_;
  auVar34._2_2_ = uVar102;
  auVar34._0_2_ = uVar102;
  fVar315 = (float)((int)sVar73 >> 8);
  fVar320 = (float)(auVar34._0_4_ >> 0x18);
  fVar321 = (float)(auVar75._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 5 + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar108._8_4_ = 0;
  auVar108._0_8_ = uVar58;
  auVar108._12_2_ = uVar102;
  auVar108._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar107._12_4_ = auVar108._12_4_;
  auVar107._8_2_ = 0;
  auVar107._0_8_ = uVar58;
  auVar107._10_2_ = uVar102;
  auVar106._10_6_ = auVar107._10_6_;
  auVar106._8_2_ = uVar102;
  auVar106._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar35._4_8_ = auVar106._8_8_;
  auVar35._2_2_ = uVar102;
  auVar35._0_2_ = uVar102;
  fVar168 = (float)((int)sVar73 >> 8);
  fVar171 = (float)(auVar35._0_4_ >> 0x18);
  fVar172 = (float)(auVar106._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 6 + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar111._8_4_ = 0;
  auVar111._0_8_ = uVar58;
  auVar111._12_2_ = uVar102;
  auVar111._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._8_2_ = 0;
  auVar110._0_8_ = uVar58;
  auVar110._10_2_ = uVar102;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._8_2_ = uVar102;
  auVar109._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar36._4_8_ = auVar109._8_8_;
  auVar36._2_2_ = uVar102;
  auVar36._0_2_ = uVar102;
  fVar202 = (float)((int)sVar73 >> 8);
  fVar212 = (float)(auVar36._0_4_ >> 0x18);
  fVar213 = (float)(auVar109._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 0xf + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar114._8_4_ = 0;
  auVar114._0_8_ = uVar58;
  auVar114._12_2_ = uVar102;
  auVar114._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._8_2_ = 0;
  auVar113._0_8_ = uVar58;
  auVar113._10_2_ = uVar102;
  auVar112._10_6_ = auVar113._10_6_;
  auVar112._8_2_ = uVar102;
  auVar112._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar37._4_8_ = auVar112._8_8_;
  auVar37._2_2_ = uVar102;
  auVar37._0_2_ = uVar102;
  fVar74 = (float)((int)sVar73 >> 8);
  fVar103 = (float)(auVar37._0_4_ >> 0x18);
  fVar104 = (float)(auVar112._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar58;
  auVar180._12_2_ = uVar102;
  auVar180._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar58;
  auVar179._10_2_ = uVar102;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar102;
  auVar178._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar38._4_8_ = auVar178._8_8_;
  auVar38._2_2_ = uVar102;
  auVar38._0_2_ = uVar102;
  fVar214 = (float)((int)sVar73 >> 8);
  fVar224 = (float)(auVar38._0_4_ >> 0x18);
  fVar226 = (float)(auVar178._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar57 + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar58;
  auVar183._12_2_ = uVar102;
  auVar183._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar58;
  auVar182._10_2_ = uVar102;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar102;
  auVar181._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar39._4_8_ = auVar181._8_8_;
  auVar39._2_2_ = uVar102;
  auVar39._0_2_ = uVar102;
  fVar241 = (float)((int)sVar73 >> 8);
  fVar254 = (float)(auVar39._0_4_ >> 0x18);
  fVar257 = (float)(auVar181._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 0x1a + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar58;
  auVar186._12_2_ = uVar102;
  auVar186._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar58;
  auVar185._10_2_ = uVar102;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar102;
  auVar184._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar40._4_8_ = auVar184._8_8_;
  auVar40._2_2_ = uVar102;
  auVar40._0_2_ = uVar102;
  fVar229 = (float)((int)sVar73 >> 8);
  fVar239 = (float)(auVar40._0_4_ >> 0x18);
  fVar240 = (float)(auVar184._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 0x1b + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar58;
  auVar189._12_2_ = uVar102;
  auVar189._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar58;
  auVar188._10_2_ = uVar102;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar102;
  auVar187._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar41._4_8_ = auVar187._8_8_;
  auVar41._2_2_ = uVar102;
  auVar41._0_2_ = uVar102;
  fVar262 = (float)((int)sVar73 >> 8);
  fVar274 = (float)(auVar41._0_4_ >> 0x18);
  fVar278 = (float)(auVar187._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar57 * 0x1c + 6);
  uVar101 = (undefined1)((uint)uVar14 >> 0x18);
  uVar102 = CONCAT11(uVar101,uVar101);
  uVar101 = (undefined1)((uint)uVar14 >> 0x10);
  uVar31 = CONCAT35(CONCAT21(uVar102,uVar101),CONCAT14(uVar101,uVar14));
  uVar101 = (undefined1)((uint)uVar14 >> 8);
  uVar33 = CONCAT51(CONCAT41((int)((ulong)uVar31 >> 0x20),uVar101),uVar101);
  sVar73 = CONCAT11((char)uVar14,(char)uVar14);
  uVar58 = CONCAT62(uVar33,sVar73);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar58;
  auVar192._12_2_ = uVar102;
  auVar192._14_2_ = uVar102;
  uVar102 = (undefined2)((ulong)uVar31 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar58;
  auVar191._10_2_ = uVar102;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar102;
  auVar190._0_8_ = uVar58;
  uVar102 = (undefined2)uVar33;
  auVar42._4_8_ = auVar190._8_8_;
  auVar42._2_2_ = uVar102;
  auVar42._0_2_ = uVar102;
  fVar105 = (float)((int)sVar73 >> 8);
  fVar124 = (float)(auVar42._0_4_ >> 0x18);
  fVar125 = (float)(auVar190._8_4_ >> 0x18);
  fVar299 = fVar126 * fVar315 + fVar143 * fVar168 + fVar144 * fVar202;
  fVar309 = fVar126 * fVar320 + fVar143 * fVar171 + fVar144 * fVar212;
  fVar311 = fVar126 * fVar321 + fVar143 * fVar172 + fVar144 * fVar213;
  fVar313 = fVar126 * (float)(auVar128._12_4_ >> 0x18) +
            fVar143 * (float)(auVar107._12_4_ >> 0x18) + fVar144 * (float)(auVar110._12_4_ >> 0x18);
  fVar285 = fVar126 * fVar74 + fVar143 * fVar214 + fVar144 * fVar241;
  fVar294 = fVar126 * fVar103 + fVar143 * fVar224 + fVar144 * fVar254;
  fVar295 = fVar126 * fVar104 + fVar143 * fVar226 + fVar144 * fVar257;
  fVar297 = fVar126 * (float)(auVar113._12_4_ >> 0x18) +
            fVar143 * (float)(auVar179._12_4_ >> 0x18) + fVar144 * (float)(auVar182._12_4_ >> 0x18);
  fVar177 = fVar126 * fVar229 + fVar143 * fVar262 + fVar144 * fVar105;
  fVar200 = fVar126 * fVar239 + fVar143 * fVar274 + fVar144 * fVar124;
  fVar201 = fVar126 * fVar240 + fVar143 * fVar278 + fVar144 * fVar125;
  fVar126 = fVar126 * (float)(auVar185._12_4_ >> 0x18) +
            fVar143 * (float)(auVar188._12_4_ >> 0x18) + fVar144 * (float)(auVar191._12_4_ >> 0x18);
  fVar316 = fVar315 * fVar146 + fVar168 * fVar163 + fVar202 * fVar165;
  fVar320 = fVar320 * fVar146 + fVar171 * fVar163 + fVar212 * fVar165;
  fVar321 = fVar321 * fVar146 + fVar172 * fVar163 + fVar213 * fVar165;
  fVar322 = (float)(auVar128._12_4_ >> 0x18) * fVar146 +
            (float)(auVar107._12_4_ >> 0x18) * fVar163 + (float)(auVar110._12_4_ >> 0x18) * fVar165;
  fVar241 = fVar74 * fVar146 + fVar214 * fVar163 + fVar241 * fVar165;
  fVar254 = fVar103 * fVar146 + fVar224 * fVar163 + fVar254 * fVar165;
  fVar257 = fVar104 * fVar146 + fVar226 * fVar163 + fVar257 * fVar165;
  fVar315 = (float)(auVar113._12_4_ >> 0x18) * fVar146 +
            (float)(auVar179._12_4_ >> 0x18) * fVar163 + (float)(auVar182._12_4_ >> 0x18) * fVar165;
  fVar229 = fVar146 * fVar229 + fVar163 * fVar262 + fVar165 * fVar105;
  fVar239 = fVar146 * fVar239 + fVar163 * fVar274 + fVar165 * fVar124;
  fVar240 = fVar146 * fVar240 + fVar163 * fVar278 + fVar165 * fVar125;
  fVar262 = fVar146 * (float)(auVar185._12_4_ >> 0x18) +
            fVar163 * (float)(auVar188._12_4_ >> 0x18) + fVar165 * (float)(auVar191._12_4_ >> 0x18);
  fVar144 = (float)DAT_01ff1d40;
  fVar74 = DAT_01ff1d40._4_4_;
  fVar103 = DAT_01ff1d40._8_4_;
  fVar104 = DAT_01ff1d40._12_4_;
  uVar68 = -(uint)(fVar144 <= ABS(fVar299));
  uVar69 = -(uint)(fVar74 <= ABS(fVar309));
  uVar71 = -(uint)(fVar103 <= ABS(fVar311));
  uVar72 = -(uint)(fVar104 <= ABS(fVar313));
  auVar301._0_4_ = (uint)fVar299 & uVar68;
  auVar301._4_4_ = (uint)fVar309 & uVar69;
  auVar301._8_4_ = (uint)fVar311 & uVar71;
  auVar301._12_4_ = (uint)fVar313 & uVar72;
  auVar148._0_4_ = ~uVar68 & (uint)fVar144;
  auVar148._4_4_ = ~uVar69 & (uint)fVar74;
  auVar148._8_4_ = ~uVar71 & (uint)fVar103;
  auVar148._12_4_ = ~uVar72 & (uint)fVar104;
  auVar148 = auVar148 | auVar301;
  uVar68 = -(uint)(fVar144 <= ABS(fVar285));
  uVar69 = -(uint)(fVar74 <= ABS(fVar294));
  uVar71 = -(uint)(fVar103 <= ABS(fVar295));
  uVar72 = -(uint)(fVar104 <= ABS(fVar297));
  auVar286._0_4_ = (uint)fVar285 & uVar68;
  auVar286._4_4_ = (uint)fVar294 & uVar69;
  auVar286._8_4_ = (uint)fVar295 & uVar71;
  auVar286._12_4_ = (uint)fVar297 & uVar72;
  auVar203._0_4_ = ~uVar68 & (uint)fVar144;
  auVar203._4_4_ = ~uVar69 & (uint)fVar74;
  auVar203._8_4_ = ~uVar71 & (uint)fVar103;
  auVar203._12_4_ = ~uVar72 & (uint)fVar104;
  auVar203 = auVar203 | auVar286;
  uVar68 = -(uint)(fVar144 <= ABS(fVar177));
  uVar69 = -(uint)(fVar74 <= ABS(fVar200));
  uVar71 = -(uint)(fVar103 <= ABS(fVar201));
  uVar72 = -(uint)(fVar104 <= ABS(fVar126));
  auVar193._0_4_ = (uint)fVar177 & uVar68;
  auVar193._4_4_ = (uint)fVar200 & uVar69;
  auVar193._8_4_ = (uint)fVar201 & uVar71;
  auVar193._12_4_ = (uint)fVar126 & uVar72;
  auVar216._0_4_ = ~uVar68 & (uint)fVar144;
  auVar216._4_4_ = ~uVar69 & (uint)fVar74;
  auVar216._8_4_ = ~uVar71 & (uint)fVar103;
  auVar216._12_4_ = ~uVar72 & (uint)fVar104;
  auVar216 = auVar216 | auVar193;
  auVar75 = rcpps(_DAT_01ff1d40,auVar148);
  fVar144 = auVar75._0_4_;
  fVar104 = auVar75._4_4_;
  fVar168 = auVar75._8_4_;
  fVar214 = auVar75._12_4_;
  fVar144 = (1.0 - auVar148._0_4_ * fVar144) * fVar144 + fVar144;
  fVar104 = (1.0 - auVar148._4_4_ * fVar104) * fVar104 + fVar104;
  fVar168 = (1.0 - auVar148._8_4_ * fVar168) * fVar168 + fVar168;
  fVar214 = (1.0 - auVar148._12_4_ * fVar214) * fVar214 + fVar214;
  auVar75 = rcpps(auVar75,auVar203);
  fVar74 = auVar75._0_4_;
  fVar105 = auVar75._4_4_;
  fVar171 = auVar75._8_4_;
  fVar224 = auVar75._12_4_;
  fVar74 = (1.0 - auVar203._0_4_ * fVar74) * fVar74 + fVar74;
  fVar105 = (1.0 - auVar203._4_4_ * fVar105) * fVar105 + fVar105;
  fVar171 = (1.0 - auVar203._8_4_ * fVar171) * fVar171 + fVar171;
  fVar224 = (1.0 - auVar203._12_4_ * fVar224) * fVar224 + fVar224;
  auVar75 = rcpps(auVar75,auVar216);
  fVar103 = auVar75._0_4_;
  fVar124 = auVar75._4_4_;
  fVar172 = auVar75._8_4_;
  fVar226 = auVar75._12_4_;
  fVar103 = (1.0 - auVar216._0_4_ * fVar103) * fVar103 + fVar103;
  fVar124 = (1.0 - auVar216._4_4_ * fVar124) * fVar124 + fVar124;
  fVar172 = (1.0 - auVar216._8_4_ * fVar172) * fVar172 + fVar172;
  fVar226 = (1.0 - auVar216._12_4_ * fVar226) * fVar226 + fVar226;
  fVar274 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar20 + 0x16)) *
            *(float *)(prim + lVar20 + 0x1a);
  uVar58 = *(ulong *)(prim + uVar57 * 7 + 6);
  uVar102 = (undefined2)(uVar58 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar58;
  auVar76._12_2_ = uVar102;
  auVar76._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar58 >> 0x20);
  auVar324._12_4_ = auVar76._12_4_;
  auVar324._8_2_ = 0;
  auVar324._0_8_ = uVar58;
  auVar324._10_2_ = uVar102;
  auVar130._10_6_ = auVar324._10_6_;
  auVar130._8_2_ = uVar102;
  auVar130._0_8_ = uVar58;
  uVar102 = (undefined2)(uVar58 >> 0x10);
  auVar43._4_8_ = auVar130._8_8_;
  auVar43._2_2_ = uVar102;
  auVar43._0_2_ = uVar102;
  fVar125 = (float)(auVar43._0_4_ >> 0x10);
  fVar177 = (float)(auVar130._8_4_ >> 0x10);
  uVar5 = *(ulong *)(prim + uVar57 * 0xb + 6);
  uVar102 = (undefined2)(uVar5 >> 0x30);
  auVar151._8_4_ = 0;
  auVar151._0_8_ = uVar5;
  auVar151._12_2_ = uVar102;
  auVar151._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar5 >> 0x20);
  auVar150._12_4_ = auVar151._12_4_;
  auVar150._8_2_ = 0;
  auVar150._0_8_ = uVar5;
  auVar150._10_2_ = uVar102;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._8_2_ = uVar102;
  auVar149._0_8_ = uVar5;
  uVar102 = (undefined2)(uVar5 >> 0x10);
  auVar44._4_8_ = auVar149._8_8_;
  auVar44._2_2_ = uVar102;
  auVar44._0_2_ = uVar102;
  uVar60 = *(ulong *)(prim + uVar57 * 9 + 6);
  uVar102 = (undefined2)(uVar60 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar60;
  auVar79._12_2_ = uVar102;
  auVar79._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar60 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar60;
  auVar78._10_2_ = uVar102;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar102;
  auVar77._0_8_ = uVar60;
  uVar102 = (undefined2)(uVar60 >> 0x10);
  auVar45._4_8_ = auVar77._8_8_;
  auVar45._2_2_ = uVar102;
  auVar45._0_2_ = uVar102;
  fVar126 = (float)(auVar45._0_4_ >> 0x10);
  fVar200 = (float)(auVar77._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar57 * 0xd + 6);
  uVar102 = (undefined2)(uVar6 >> 0x30);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar6;
  auVar219._12_2_ = uVar102;
  auVar219._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar6 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar6;
  auVar218._10_2_ = uVar102;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar102;
  auVar217._0_8_ = uVar6;
  uVar102 = (undefined2)(uVar6 >> 0x10);
  auVar46._4_8_ = auVar217._8_8_;
  auVar46._2_2_ = uVar102;
  auVar46._0_2_ = uVar102;
  uVar7 = *(ulong *)(prim + uVar57 * 0x12 + 6);
  uVar102 = (undefined2)(uVar7 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar7;
  auVar82._12_2_ = uVar102;
  auVar82._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar7 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar7;
  auVar81._10_2_ = uVar102;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar102;
  auVar80._0_8_ = uVar7;
  uVar102 = (undefined2)(uVar7 >> 0x10);
  auVar47._4_8_ = auVar80._8_8_;
  auVar47._2_2_ = uVar102;
  auVar47._0_2_ = uVar102;
  fVar143 = (float)(auVar47._0_4_ >> 0x10);
  fVar201 = (float)(auVar80._8_4_ >> 0x10);
  uVar64 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  uVar8 = *(ulong *)(prim + uVar57 * 2 + uVar64 + 6);
  uVar102 = (undefined2)(uVar8 >> 0x30);
  auVar246._8_4_ = 0;
  auVar246._0_8_ = uVar8;
  auVar246._12_2_ = uVar102;
  auVar246._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar8 >> 0x20);
  auVar245._12_4_ = auVar246._12_4_;
  auVar245._8_2_ = 0;
  auVar245._0_8_ = uVar8;
  auVar245._10_2_ = uVar102;
  auVar244._10_6_ = auVar245._10_6_;
  auVar244._8_2_ = uVar102;
  auVar244._0_8_ = uVar8;
  uVar102 = (undefined2)(uVar8 >> 0x10);
  auVar48._4_8_ = auVar244._8_8_;
  auVar48._2_2_ = uVar102;
  auVar48._0_2_ = uVar102;
  uVar64 = *(ulong *)(prim + uVar64 + 6);
  uVar102 = (undefined2)(uVar64 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar64;
  auVar85._12_2_ = uVar102;
  auVar85._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar64 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar64;
  auVar84._10_2_ = uVar102;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar102;
  auVar83._0_8_ = uVar64;
  uVar102 = (undefined2)(uVar64 >> 0x10);
  auVar49._4_8_ = auVar83._8_8_;
  auVar49._2_2_ = uVar102;
  auVar49._0_2_ = uVar102;
  fVar146 = (float)(auVar49._0_4_ >> 0x10);
  fVar202 = (float)(auVar83._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar57 * 0x18 + 6);
  uVar102 = (undefined2)(uVar9 >> 0x30);
  auVar268._8_4_ = 0;
  auVar268._0_8_ = uVar9;
  auVar268._12_2_ = uVar102;
  auVar268._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar9 >> 0x20);
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._8_2_ = 0;
  auVar267._0_8_ = uVar9;
  auVar267._10_2_ = uVar102;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._8_2_ = uVar102;
  auVar266._0_8_ = uVar9;
  uVar102 = (undefined2)(uVar9 >> 0x10);
  auVar50._4_8_ = auVar266._8_8_;
  auVar50._2_2_ = uVar102;
  auVar50._0_2_ = uVar102;
  uVar10 = *(ulong *)(prim + uVar57 * 0x1d + 6);
  uVar102 = (undefined2)(uVar10 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar10;
  auVar88._12_2_ = uVar102;
  auVar88._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar10 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar10;
  auVar87._10_2_ = uVar102;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar102;
  auVar86._0_8_ = uVar10;
  uVar102 = (undefined2)(uVar10 >> 0x10);
  auVar51._4_8_ = auVar86._8_8_;
  auVar51._2_2_ = uVar102;
  auVar51._0_2_ = uVar102;
  fVar163 = (float)(auVar51._0_4_ >> 0x10);
  fVar212 = (float)(auVar86._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar57 + (ulong)(byte)PVar13 * 0x20 + 6);
  uVar102 = (undefined2)(uVar11 >> 0x30);
  auVar289._8_4_ = 0;
  auVar289._0_8_ = uVar11;
  auVar289._12_2_ = uVar102;
  auVar289._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar11 >> 0x20);
  auVar288._12_4_ = auVar289._12_4_;
  auVar288._8_2_ = 0;
  auVar288._0_8_ = uVar11;
  auVar288._10_2_ = uVar102;
  auVar287._10_6_ = auVar288._10_6_;
  auVar287._8_2_ = uVar102;
  auVar287._0_8_ = uVar11;
  uVar102 = (undefined2)(uVar11 >> 0x10);
  auVar52._4_8_ = auVar287._8_8_;
  auVar52._2_2_ = uVar102;
  auVar52._0_2_ = uVar102;
  uVar12 = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar57) + 6);
  uVar102 = (undefined2)(uVar12 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar12;
  auVar91._12_2_ = uVar102;
  auVar91._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar12 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar12;
  auVar90._10_2_ = uVar102;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar102;
  auVar89._0_8_ = uVar12;
  uVar102 = (undefined2)(uVar12 >> 0x10);
  auVar53._4_8_ = auVar89._8_8_;
  auVar53._2_2_ = uVar102;
  auVar53._0_2_ = uVar102;
  fVar165 = (float)(auVar53._0_4_ >> 0x10);
  fVar213 = (float)(auVar89._8_4_ >> 0x10);
  uVar57 = *(ulong *)(prim + uVar57 * 0x23 + 6);
  uVar102 = (undefined2)(uVar57 >> 0x30);
  auVar304._8_4_ = 0;
  auVar304._0_8_ = uVar57;
  auVar304._12_2_ = uVar102;
  auVar304._14_2_ = uVar102;
  uVar102 = (undefined2)(uVar57 >> 0x20);
  auVar303._12_4_ = auVar304._12_4_;
  auVar303._8_2_ = 0;
  auVar303._0_8_ = uVar57;
  auVar303._10_2_ = uVar102;
  auVar302._10_6_ = auVar303._10_6_;
  auVar302._8_2_ = uVar102;
  auVar302._0_8_ = uVar57;
  uVar102 = (undefined2)(uVar57 >> 0x10);
  auVar54._4_8_ = auVar302._8_8_;
  auVar54._2_2_ = uVar102;
  auVar54._0_2_ = uVar102;
  auVar152._0_8_ =
       CONCAT44(((((float)(auVar44._0_4_ >> 0x10) - fVar125) * fVar274 + fVar125) - fVar320) *
                fVar104,((((float)(int)(short)uVar5 - (float)(int)(short)uVar58) * fVar274 +
                         (float)(int)(short)uVar58) - fVar316) * fVar144);
  auVar152._8_4_ =
       ((((float)(auVar149._8_4_ >> 0x10) - fVar177) * fVar274 + fVar177) - fVar321) * fVar168;
  auVar152._12_4_ =
       ((((float)(auVar150._12_4_ >> 0x10) - (float)(auVar324._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar324._12_4_ >> 0x10)) - fVar322) * fVar214;
  auVar220._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar60) * fVar274 +
        (float)(int)(short)uVar60) - fVar316) * fVar144;
  auVar220._4_4_ =
       ((((float)(auVar46._0_4_ >> 0x10) - fVar126) * fVar274 + fVar126) - fVar320) * fVar104;
  auVar220._8_4_ =
       ((((float)(auVar217._8_4_ >> 0x10) - fVar200) * fVar274 + fVar200) - fVar321) * fVar168;
  auVar220._12_4_ =
       ((((float)(auVar218._12_4_ >> 0x10) - (float)(auVar78._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar78._12_4_ >> 0x10)) - fVar322) * fVar214;
  auVar247._0_8_ =
       CONCAT44(((((float)(auVar48._0_4_ >> 0x10) - fVar143) * fVar274 + fVar143) - fVar254) *
                fVar105,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar274 +
                         (float)(int)(short)uVar7) - fVar241) * fVar74);
  auVar247._8_4_ =
       ((((float)(auVar244._8_4_ >> 0x10) - fVar201) * fVar274 + fVar201) - fVar257) * fVar171;
  auVar247._12_4_ =
       ((((float)(auVar245._12_4_ >> 0x10) - (float)(auVar81._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar81._12_4_ >> 0x10)) - fVar315) * fVar224;
  auVar269._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar64) * fVar274 +
        (float)(int)(short)uVar64) - fVar241) * fVar74;
  auVar269._4_4_ =
       ((((float)(auVar50._0_4_ >> 0x10) - fVar146) * fVar274 + fVar146) - fVar254) * fVar105;
  auVar269._8_4_ =
       ((((float)(auVar266._8_4_ >> 0x10) - fVar202) * fVar274 + fVar202) - fVar257) * fVar171;
  auVar269._12_4_ =
       ((((float)(auVar267._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar315) * fVar224;
  auVar290._0_8_ =
       CONCAT44(((((float)(auVar52._0_4_ >> 0x10) - fVar163) * fVar274 + fVar163) - fVar239) *
                fVar124,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar274 +
                         (float)(int)(short)uVar10) - fVar229) * fVar103);
  auVar290._8_4_ =
       ((((float)(auVar287._8_4_ >> 0x10) - fVar212) * fVar274 + fVar212) - fVar240) * fVar172;
  auVar290._12_4_ =
       ((((float)(auVar288._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar262) * fVar226;
  auVar305._0_4_ =
       ((((float)(int)(short)uVar57 - (float)(int)(short)uVar12) * fVar274 +
        (float)(int)(short)uVar12) - fVar229) * fVar103;
  auVar305._4_4_ =
       ((((float)(auVar54._0_4_ >> 0x10) - fVar165) * fVar274 + fVar165) - fVar239) * fVar124;
  auVar305._8_4_ =
       ((((float)(auVar302._8_4_ >> 0x10) - fVar213) * fVar274 + fVar213) - fVar240) * fVar172;
  auVar305._12_4_ =
       ((((float)(auVar303._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar274 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar262) * fVar226;
  auVar127._8_4_ = auVar152._8_4_;
  auVar127._0_8_ = auVar152._0_8_;
  auVar127._12_4_ = auVar152._12_4_;
  auVar128 = minps(auVar127,auVar220);
  auVar92._8_4_ = auVar247._8_4_;
  auVar92._0_8_ = auVar247._0_8_;
  auVar92._12_4_ = auVar247._12_4_;
  auVar75 = minps(auVar92,auVar269);
  auVar128 = maxps(auVar128,auVar75);
  auVar93._8_4_ = auVar290._8_4_;
  auVar93._0_8_ = auVar290._0_8_;
  auVar93._12_4_ = auVar290._12_4_;
  auVar75 = minps(auVar93,auVar305);
  uVar14 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar115._4_4_ = uVar14;
  auVar115._0_4_ = uVar14;
  auVar115._8_4_ = uVar14;
  auVar115._12_4_ = uVar14;
  auVar75 = maxps(auVar75,auVar115);
  auVar75 = maxps(auVar128,auVar75);
  local_1b8 = auVar75._0_4_ * 0.99999964;
  fStack_1b4 = auVar75._4_4_ * 0.99999964;
  fStack_1b0 = auVar75._8_4_ * 0.99999964;
  fStack_1ac = auVar75._12_4_ * 0.99999964;
  auVar75 = maxps(auVar152,auVar220);
  auVar128 = maxps(auVar247,auVar269);
  auVar75 = minps(auVar75,auVar128);
  auVar128 = maxps(auVar290,auVar305);
  fVar144 = (ray->super_RayK<1>).tfar;
  auVar94._4_4_ = fVar144;
  auVar94._0_4_ = fVar144;
  auVar94._8_4_ = fVar144;
  auVar94._12_4_ = fVar144;
  auVar128 = minps(auVar128,auVar94);
  auVar75 = minps(auVar75,auVar128);
  uVar68 = (uint)(byte)PVar13;
  auVar116._0_4_ = -(uint)(uVar68 != 0 && local_1b8 <= auVar75._0_4_ * 1.0000004);
  auVar116._4_4_ = -(uint)(1 < uVar68 && fStack_1b4 <= auVar75._4_4_ * 1.0000004);
  auVar116._8_4_ = -(uint)(2 < uVar68 && fStack_1b0 <= auVar75._8_4_ * 1.0000004);
  auVar116._12_4_ = -(uint)(3 < uVar68 && fStack_1ac <= auVar75._12_4_ * 1.0000004);
  uVar68 = movmskps(uVar68,auVar116);
  if (uVar68 == 0) {
    return;
  }
  uVar68 = uVar68 & 0xff;
  local_168._0_12_ = mm_lookupmask_ps._240_12_;
  local_168._12_4_ = 0;
  local_2f0 = prim;
LAB_00beef62:
  lVar20 = 0;
  if ((ulong)uVar68 != 0) {
    for (; (uVar68 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
    }
  }
  uVar69 = *(uint *)(local_2f0 + 2);
  uVar71 = *(uint *)(local_2f0 + lVar20 * 4 + 6);
  pGVar15 = (context->scene->geometries).items[uVar69].ptr;
  fVar144 = pGVar15->fnumTimeSegments;
  fVar74 = (pGVar15->time_range).lower;
  fVar103 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar74) /
            ((pGVar15->time_range).upper - fVar74)) * fVar144;
  fVar74 = floorf(fVar103);
  fVar144 = fVar144 + -1.0;
  if (fVar144 <= fVar74) {
    fVar74 = fVar144;
  }
  fVar144 = 0.0;
  if (0.0 <= fVar74) {
    fVar144 = fVar74;
  }
  fVar103 = fVar103 - fVar144;
  local_340 = (ulong)uVar71;
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                           (ulong)uVar71 *
                           pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)fVar144 * 0x38;
  lVar17 = *(long *)(_Var16 + lVar66);
  lVar18 = *(long *)(_Var16 + 0x10 + lVar66);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar58);
  fVar144 = *pfVar3;
  fVar74 = pfVar3[1];
  fVar104 = pfVar3[2];
  fVar105 = pfVar3[3];
  lVar20 = uVar58 + 1;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar20);
  fVar124 = *pfVar3;
  fVar125 = pfVar3[1];
  fVar126 = pfVar3[2];
  fVar143 = pfVar3[3];
  lVar1 = uVar58 + 2;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar146 = *pfVar3;
  fVar163 = pfVar3[1];
  fVar165 = pfVar3[2];
  fVar168 = pfVar3[3];
  lVar2 = uVar58 + 3;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar171 = *pfVar3;
  fVar172 = pfVar3[1];
  fVar177 = pfVar3[2];
  fVar200 = pfVar3[3];
  lVar17 = *(long *)&pGVar15[4].fnumTimeSegments;
  lVar18 = *(long *)(lVar17 + lVar66);
  lVar19 = *(long *)(lVar17 + 0x10 + lVar66);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar58);
  fVar201 = *pfVar3;
  fVar202 = pfVar3[1];
  fVar212 = pfVar3[2];
  fVar213 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar20);
  fVar214 = *pfVar3;
  fVar224 = pfVar3[1];
  fVar226 = pfVar3[2];
  fVar241 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar254 = *pfVar3;
  fVar257 = pfVar3[1];
  fVar315 = pfVar3[2];
  fVar229 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar239 = *pfVar3;
  fVar240 = pfVar3[1];
  fVar262 = pfVar3[2];
  fVar274 = pfVar3[3];
  fVar278 = fVar144 * 0.16666667 + fVar124 * 0.6666667 + fVar146 * 0.16666667 + fVar171 * 0.0;
  fVar285 = fVar74 * 0.16666667 + fVar125 * 0.6666667 + fVar163 * 0.16666667 + fVar172 * 0.0;
  fVar294 = fVar104 * 0.16666667 + fVar126 * 0.6666667 + fVar165 * 0.16666667 + fVar177 * 0.0;
  fVar295 = fVar105 * 0.16666667 + fVar143 * 0.6666667 + fVar168 * 0.16666667 + fVar200 * 0.0;
  fVar313 = ((fVar146 * 0.5 + fVar171 * 0.0) - fVar124 * 0.0) - fVar144 * 0.5;
  fVar320 = ((fVar163 * 0.5 + fVar172 * 0.0) - fVar125 * 0.0) - fVar74 * 0.5;
  fVar322 = ((fVar165 * 0.5 + fVar177 * 0.0) - fVar126 * 0.0) - fVar104 * 0.5;
  fVar145 = ((fVar168 * 0.5 + fVar200 * 0.0) - fVar143 * 0.0) - fVar105 * 0.5;
  fVar300 = fVar201 * 0.16666667 + fVar214 * 0.6666667 + fVar254 * 0.16666667 + fVar239 * 0.0;
  fVar310 = fVar202 * 0.16666667 + fVar224 * 0.6666667 + fVar257 * 0.16666667 + fVar240 * 0.0;
  fVar312 = fVar212 * 0.16666667 + fVar226 * 0.6666667 + fVar315 * 0.16666667 + fVar262 * 0.0;
  fVar314 = fVar213 * 0.16666667 + fVar241 * 0.6666667 + fVar229 * 0.16666667 + fVar274 * 0.0;
  fVar316 = ((fVar254 * 0.5 + fVar239 * 0.0) - fVar214 * 0.0) - fVar201 * 0.5;
  fVar321 = ((fVar257 * 0.5 + fVar240 * 0.0) - fVar224 * 0.0) - fVar202 * 0.5;
  fVar296 = ((fVar315 * 0.5 + fVar262 * 0.0) - fVar226 * 0.0) - fVar212 * 0.5;
  fVar298 = ((fVar229 * 0.5 + fVar274 * 0.0) - fVar241 * 0.0) - fVar213 * 0.5;
  fVar147 = fVar124 * 0.16666667 + fVar146 * 0.6666667 + fVar171 * 0.16666667 + fVar144 * 0.0;
  fVar164 = fVar125 * 0.16666667 + fVar163 * 0.6666667 + fVar172 * 0.16666667 + fVar74 * 0.0;
  fVar166 = fVar126 * 0.16666667 + fVar165 * 0.6666667 + fVar177 * 0.16666667 + fVar104 * 0.0;
  fVar167 = fVar143 * 0.16666667 + fVar168 * 0.6666667 + fVar200 * 0.16666667 + fVar105 * 0.0;
  fVar297 = ((fVar146 * 0.0 + fVar171 * 0.5) - fVar124 * 0.5) - fVar144 * 0.0;
  fVar299 = ((fVar163 * 0.0 + fVar172 * 0.5) - fVar125 * 0.5) - fVar74 * 0.0;
  fVar309 = ((fVar165 * 0.0 + fVar177 * 0.5) - fVar126 * 0.5) - fVar104 * 0.0;
  fVar311 = ((fVar168 * 0.0 + fVar200 * 0.5) - fVar143 * 0.5) - fVar105 * 0.0;
  fVar124 = fVar214 * 0.16666667 + fVar254 * 0.6666667 + fVar239 * 0.16666667 + fVar201 * 0.0;
  fVar125 = fVar224 * 0.16666667 + fVar257 * 0.6666667 + fVar240 * 0.16666667 + fVar202 * 0.0;
  fVar126 = fVar226 * 0.16666667 + fVar315 * 0.6666667 + fVar262 * 0.16666667 + fVar212 * 0.0;
  fVar146 = fVar241 * 0.16666667 + fVar229 * 0.6666667 + fVar274 * 0.16666667 + fVar213 * 0.0;
  fVar144 = ((fVar254 * 0.0 + fVar239 * 0.5) - fVar214 * 0.5) - fVar201 * 0.0;
  fVar74 = ((fVar257 * 0.0 + fVar240 * 0.5) - fVar224 * 0.5) - fVar202 * 0.0;
  fVar104 = ((fVar315 * 0.0 + fVar262 * 0.5) - fVar226 * 0.5) - fVar212 * 0.0;
  fVar105 = ((fVar229 * 0.0 + fVar274 * 0.5) - fVar241 * 0.5) - fVar213 * 0.0;
  fVar214 = fVar320 * fVar300 - fVar310 * fVar313;
  fVar226 = fVar322 * fVar310 - fVar312 * fVar320;
  fVar241 = fVar313 * fVar312 - fVar300 * fVar322;
  fVar254 = fVar145 * fVar314 - fVar314 * fVar145;
  fVar171 = fVar320 * fVar316 - fVar321 * fVar313;
  fVar177 = fVar322 * fVar321 - fVar296 * fVar320;
  fVar200 = fVar313 * fVar296 - fVar316 * fVar322;
  fVar143 = fVar299 * fVar124 - fVar125 * fVar297;
  fVar163 = fVar309 * fVar125 - fVar126 * fVar299;
  fVar165 = fVar297 * fVar126 - fVar124 * fVar309;
  fVar168 = fVar311 * fVar146 - fVar146 * fVar311;
  fVar124 = fVar299 * fVar144 - fVar74 * fVar297;
  fVar125 = fVar309 * fVar74 - fVar104 * fVar299;
  fVar104 = fVar297 * fVar104 - fVar144 * fVar309;
  fVar202 = fVar241 * fVar241 + fVar226 * fVar226 + fVar214 * fVar214;
  auVar128 = ZEXT416((uint)fVar202);
  auVar75 = rsqrtss(ZEXT416((uint)fVar202),auVar128);
  fVar144 = auVar75._0_4_;
  fVar212 = fVar144 * 1.5 - fVar144 * fVar144 * fVar202 * 0.5 * fVar144;
  fVar224 = fVar214 * fVar171 + fVar241 * fVar200 + fVar226 * fVar177;
  fVar144 = fVar254 * fVar212;
  auVar75 = rcpss(auVar128,auVar128);
  fVar172 = (2.0 - fVar202 * auVar75._0_4_) * auVar75._0_4_;
  fVar201 = fVar165 * fVar165 + fVar163 * fVar163 + fVar143 * fVar143;
  auVar75 = ZEXT416((uint)fVar201);
  auVar128 = rsqrtss(ZEXT416((uint)fVar201),auVar75);
  fVar74 = auVar128._0_4_;
  fVar146 = fVar74 * 1.5 - fVar74 * fVar74 * fVar201 * 0.5 * fVar74;
  fVar213 = fVar143 * fVar124 + fVar165 * fVar104 + fVar163 * fVar125;
  fVar126 = fVar168 * fVar146;
  auVar75 = rcpss(auVar75,auVar75);
  fVar74 = (2.0 - fVar201 * auVar75._0_4_) * auVar75._0_4_;
  fVar215 = fVar295 * fVar226 * fVar212;
  fVar225 = fVar295 * fVar241 * fVar212;
  fVar227 = fVar295 * fVar214 * fVar212;
  fVar228 = fVar295 * fVar144;
  fVar263 = fVar278 - fVar215;
  fVar275 = fVar285 - fVar225;
  fVar279 = fVar294 - fVar227;
  fVar282 = fVar295 - fVar228;
  fVar242 = fVar295 * fVar172 * (fVar202 * fVar177 - fVar224 * fVar226) * fVar212 +
            fVar145 * fVar226 * fVar212;
  fVar255 = fVar295 * fVar172 * (fVar202 * fVar200 - fVar224 * fVar241) * fVar212 +
            fVar145 * fVar241 * fVar212;
  fVar258 = fVar295 * fVar172 * (fVar202 * fVar171 - fVar224 * fVar214) * fVar212 +
            fVar145 * fVar214 * fVar212;
  fVar260 = fVar295 * fVar172 * (fVar202 * (fVar145 * fVar298 - fVar298 * fVar145) -
                                fVar224 * fVar254) * fVar212 + fVar145 * fVar144;
  fVar215 = fVar215 + fVar278;
  fVar225 = fVar225 + fVar285;
  fVar227 = fVar227 + fVar294;
  fVar228 = fVar228 + fVar295;
  fVar278 = fVar167 * fVar163 * fVar146;
  fVar285 = fVar167 * fVar165 * fVar146;
  fVar294 = fVar167 * fVar143 * fVar146;
  fVar295 = fVar167 * fVar126;
  fVar300 = fVar147 - fVar278;
  fVar312 = fVar164 - fVar285;
  fVar173 = fVar166 - fVar294;
  fVar175 = fVar167 - fVar295;
  fVar316 = fVar167 * fVar74 * (fVar201 * fVar125 - fVar213 * fVar163) * fVar146 +
            fVar311 * fVar163 * fVar146;
  fVar321 = fVar167 * fVar74 * (fVar201 * fVar104 - fVar213 * fVar165) * fVar146 +
            fVar311 * fVar165 * fVar146;
  fVar296 = fVar167 * fVar74 * (fVar201 * fVar124 - fVar213 * fVar143) * fVar146 +
            fVar311 * fVar143 * fVar146;
  fVar298 = fVar167 * fVar74 * (fVar201 * (fVar311 * fVar105 - fVar105 * fVar311) -
                               fVar213 * fVar168) * fVar146 + fVar311 * fVar126;
  fVar278 = fVar278 + fVar147;
  fVar285 = fVar285 + fVar164;
  fVar294 = fVar294 + fVar166;
  fVar295 = fVar295 + fVar167;
  lVar18 = *(long *)(_Var16 + 0x38 + lVar66);
  lVar19 = *(long *)(_Var16 + 0x48 + lVar66);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar58);
  fVar144 = *pfVar3;
  fVar74 = pfVar3[1];
  fVar104 = pfVar3[2];
  fVar105 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar20);
  fVar124 = *pfVar3;
  fVar125 = pfVar3[1];
  fVar126 = pfVar3[2];
  fVar143 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar146 = *pfVar3;
  fVar163 = pfVar3[1];
  fVar165 = pfVar3[2];
  fVar168 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar171 = *pfVar3;
  fVar172 = pfVar3[1];
  fVar177 = pfVar3[2];
  fVar200 = pfVar3[3];
  lVar18 = *(long *)(lVar17 + 0x38 + lVar66);
  lVar17 = *(long *)(lVar17 + 0x48 + lVar66);
  pRVar62 = (RTCIntersectArguments *)(lVar20 * lVar17);
  fVar264 = fVar144 * 0.16666667 + fVar124 * 0.6666667 + fVar146 * 0.16666667 + fVar171 * 0.0;
  fVar276 = fVar74 * 0.16666667 + fVar125 * 0.6666667 + fVar163 * 0.16666667 + fVar172 * 0.0;
  fVar280 = fVar104 * 0.16666667 + fVar126 * 0.6666667 + fVar165 * 0.16666667 + fVar177 * 0.0;
  fVar283 = fVar105 * 0.16666667 + fVar143 * 0.6666667 + fVar168 * 0.16666667 + fVar200 * 0.0;
  fVar147 = ((fVar146 * 0.5 + fVar171 * 0.0) - fVar124 * 0.0) - fVar144 * 0.5;
  fVar164 = ((fVar163 * 0.5 + fVar172 * 0.0) - fVar125 * 0.0) - fVar74 * 0.5;
  fVar166 = ((fVar165 * 0.5 + fVar177 * 0.0) - fVar126 * 0.0) - fVar104 * 0.5;
  fVar167 = ((fVar168 * 0.5 + fVar200 * 0.0) - fVar143 * 0.0) - fVar105 * 0.5;
  pfVar3 = (float *)(lVar18 + lVar17 * lVar2);
  fVar201 = *pfVar3;
  fVar202 = pfVar3[1];
  fVar212 = pfVar3[2];
  fVar213 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar1 * lVar17);
  fVar214 = *pfVar3;
  fVar224 = pfVar3[1];
  fVar226 = pfVar3[2];
  fVar241 = pfVar3[3];
  pfVar3 = (float *)((long)&pRVar62->flags + lVar18);
  fVar254 = *pfVar3;
  fVar257 = pfVar3[1];
  fVar315 = pfVar3[2];
  fVar229 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + uVar58 * lVar17);
  fVar239 = *pfVar3;
  fVar240 = pfVar3[1];
  fVar262 = pfVar3[2];
  fVar274 = pfVar3[3];
  fVar265 = fVar239 * 0.16666667 + fVar254 * 0.6666667 + fVar214 * 0.16666667 + fVar201 * 0.0;
  fVar277 = fVar240 * 0.16666667 + fVar257 * 0.6666667 + fVar224 * 0.16666667 + fVar202 * 0.0;
  fVar281 = fVar262 * 0.16666667 + fVar315 * 0.6666667 + fVar226 * 0.16666667 + fVar212 * 0.0;
  fVar284 = fVar274 * 0.16666667 + fVar229 * 0.6666667 + fVar241 * 0.16666667 + fVar213 * 0.0;
  fVar243 = ((fVar214 * 0.5 + fVar201 * 0.0) - fVar254 * 0.0) - fVar239 * 0.5;
  fVar256 = ((fVar224 * 0.5 + fVar202 * 0.0) - fVar257 * 0.0) - fVar240 * 0.5;
  fVar259 = ((fVar226 * 0.5 + fVar212 * 0.0) - fVar315 * 0.0) - fVar262 * 0.5;
  fVar261 = ((fVar241 * 0.5 + fVar213 * 0.0) - fVar229 * 0.0) - fVar274 * 0.5;
  fVar310 = fVar124 * 0.16666667 + fVar146 * 0.6666667 + fVar171 * 0.16666667 + fVar144 * 0.0;
  fVar314 = fVar125 * 0.16666667 + fVar163 * 0.6666667 + fVar172 * 0.16666667 + fVar74 * 0.0;
  fVar174 = fVar126 * 0.16666667 + fVar165 * 0.6666667 + fVar177 * 0.16666667 + fVar104 * 0.0;
  fVar176 = fVar143 * 0.16666667 + fVar168 * 0.6666667 + fVar200 * 0.16666667 + fVar105 * 0.0;
  fVar144 = ((fVar146 * 0.0 + fVar171 * 0.5) - fVar124 * 0.5) - fVar144 * 0.0;
  fVar74 = ((fVar163 * 0.0 + fVar172 * 0.5) - fVar125 * 0.5) - fVar74 * 0.0;
  fVar104 = ((fVar165 * 0.0 + fVar177 * 0.5) - fVar126 * 0.5) - fVar104 * 0.0;
  fVar105 = ((fVar168 * 0.0 + fVar200 * 0.5) - fVar143 * 0.5) - fVar105 * 0.0;
  fVar146 = fVar254 * 0.16666667 + fVar214 * 0.6666667 + fVar201 * 0.16666667 + fVar239 * 0.0;
  fVar163 = fVar257 * 0.16666667 + fVar224 * 0.6666667 + fVar202 * 0.16666667 + fVar240 * 0.0;
  fVar165 = fVar315 * 0.16666667 + fVar226 * 0.6666667 + fVar212 * 0.16666667 + fVar262 * 0.0;
  fVar200 = fVar229 * 0.16666667 + fVar241 * 0.6666667 + fVar213 * 0.16666667 + fVar274 * 0.0;
  fVar124 = ((fVar214 * 0.0 + fVar201 * 0.5) - fVar254 * 0.5) - fVar239 * 0.0;
  fVar125 = ((fVar224 * 0.0 + fVar202 * 0.5) - fVar257 * 0.5) - fVar240 * 0.0;
  fVar126 = ((fVar226 * 0.0 + fVar212 * 0.5) - fVar315 * 0.5) - fVar262 * 0.0;
  fVar168 = ((fVar241 * 0.0 + fVar213 * 0.5) - fVar229 * 0.5) - fVar274 * 0.0;
  fVar177 = fVar164 * fVar265 - fVar277 * fVar147;
  fVar224 = fVar166 * fVar277 - fVar281 * fVar164;
  fVar241 = fVar147 * fVar281 - fVar265 * fVar166;
  fVar257 = fVar167 * fVar284 - fVar284 * fVar167;
  fVar143 = fVar164 * fVar243 - fVar256 * fVar147;
  fVar171 = fVar166 * fVar256 - fVar259 * fVar164;
  fVar172 = fVar147 * fVar259 - fVar243 * fVar166;
  fVar214 = fVar74 * fVar146 - fVar163 * fVar144;
  fVar226 = fVar104 * fVar163 - fVar165 * fVar74;
  fVar254 = fVar144 * fVar165 - fVar146 * fVar104;
  fVar315 = fVar105 * fVar200 - fVar200 * fVar105;
  fVar146 = fVar74 * fVar124 - fVar125 * fVar144;
  fVar163 = fVar104 * fVar125 - fVar126 * fVar74;
  fVar165 = fVar144 * fVar126 - fVar124 * fVar104;
  fVar124 = fVar241 * fVar241 + fVar224 * fVar224 + fVar177 * fVar177;
  auVar75 = ZEXT416((uint)fVar124);
  auVar128 = rsqrtss(ZEXT416((uint)fVar124),auVar75);
  fVar125 = auVar128._0_4_;
  fVar200 = fVar125 * 1.5 - fVar125 * fVar125 * fVar124 * 0.5 * fVar125;
  fVar229 = fVar177 * fVar143 + fVar241 * fVar172 + fVar224 * fVar171;
  auVar75 = rcpss(auVar75,auVar75);
  fVar125 = (2.0 - fVar124 * auVar75._0_4_) * auVar75._0_4_;
  fVar126 = fVar257 * fVar200;
  fVar240 = fVar254 * fVar254 + fVar226 * fVar226 + fVar214 * fVar214;
  auVar75 = ZEXT416((uint)fVar240);
  auVar128 = rsqrtss(ZEXT416((uint)fVar240),auVar75);
  fVar201 = auVar128._0_4_;
  fVar274 = fVar201 * 1.5 - fVar201 * fVar201 * fVar240 * 0.5 * fVar201;
  fVar243 = fVar214 * fVar146 + fVar254 * fVar165 + fVar226 * fVar163;
  auVar75 = rcpss(auVar75,auVar75);
  fVar256 = (2.0 - fVar240 * auVar75._0_4_) * auVar75._0_4_;
  fVar262 = fVar315 * fVar274;
  fVar201 = fVar283 * fVar224 * fVar200;
  fVar202 = fVar283 * fVar241 * fVar200;
  fVar212 = fVar283 * fVar177 * fVar200;
  fVar213 = fVar283 * fVar126;
  fVar171 = fVar283 * fVar125 * (fVar124 * fVar171 - fVar229 * fVar224) * fVar200 +
            fVar167 * fVar224 * fVar200;
  fVar172 = fVar283 * fVar125 * (fVar124 * fVar172 - fVar229 * fVar241) * fVar200 +
            fVar167 * fVar241 * fVar200;
  fVar177 = fVar283 * fVar125 * (fVar124 * fVar143 - fVar229 * fVar177) * fVar200 +
            fVar167 * fVar177 * fVar200;
  fVar200 = fVar283 * fVar125 * (fVar124 * (fVar167 * fVar261 - fVar261 * fVar167) -
                                fVar229 * fVar257) * fVar200 + fVar167 * fVar126;
  fVar224 = fVar264 - fVar201;
  fVar241 = fVar276 - fVar202;
  fVar257 = fVar280 - fVar212;
  fVar229 = fVar283 - fVar213;
  fVar201 = fVar201 + fVar264;
  fVar202 = fVar202 + fVar276;
  fVar212 = fVar212 + fVar280;
  fVar213 = fVar213 + fVar283;
  fVar124 = fVar176 * fVar226 * fVar274;
  fVar125 = fVar176 * fVar254 * fVar274;
  fVar126 = fVar176 * fVar214 * fVar274;
  fVar143 = fVar176 * fVar262;
  fVar226 = fVar176 * fVar256 * (fVar240 * fVar163 - fVar243 * fVar226) * fVar274 +
            fVar105 * fVar226 * fVar274;
  fVar254 = fVar176 * fVar256 * (fVar240 * fVar165 - fVar243 * fVar254) * fVar274 +
            fVar105 * fVar254 * fVar274;
  fVar239 = fVar176 * fVar256 * (fVar240 * fVar146 - fVar243 * fVar214) * fVar274 +
            fVar105 * fVar214 * fVar274;
  fVar315 = fVar176 * fVar256 * (fVar240 * (fVar105 * fVar168 - fVar168 * fVar105) -
                                fVar243 * fVar315) * fVar274 + fVar105 * fVar262;
  fVar146 = fVar310 - fVar124;
  fVar163 = fVar314 - fVar125;
  fVar165 = fVar174 - fVar126;
  fVar168 = fVar176 - fVar143;
  fVar124 = fVar124 + fVar310;
  fVar125 = fVar125 + fVar314;
  fVar126 = fVar126 + fVar174;
  fVar143 = fVar143 + fVar176;
  fVar214 = 1.0 - fVar103;
  local_378 = fVar263 * fVar214 + fVar224 * fVar103;
  fStack_374 = fVar275 * fVar214 + fVar241 * fVar103;
  fStack_370 = fVar279 * fVar214 + fVar257 * fVar103;
  fStack_36c = fVar282 * fVar214 + fVar229 * fVar103;
  local_388 = ((fVar313 - fVar242) * 0.33333334 + fVar263) * fVar214 +
              ((fVar147 - fVar171) * 0.33333334 + fVar224) * fVar103;
  fStack_384 = ((fVar320 - fVar255) * 0.33333334 + fVar275) * fVar214 +
               ((fVar164 - fVar172) * 0.33333334 + fVar241) * fVar103;
  fStack_380 = ((fVar322 - fVar258) * 0.33333334 + fVar279) * fVar214 +
               ((fVar166 - fVar177) * 0.33333334 + fVar257) * fVar103;
  fStack_37c = ((fVar145 - fVar260) * 0.33333334 + fVar282) * fVar214 +
               ((fVar167 - fVar200) * 0.33333334 + fVar229) * fVar103;
  local_3a8 = (fVar300 - (fVar297 - fVar316) * 0.33333334) * fVar214 +
              (fVar146 - (fVar144 - fVar226) * 0.33333334) * fVar103;
  fStack_3a4 = (fVar312 - (fVar299 - fVar321) * 0.33333334) * fVar214 +
               (fVar163 - (fVar74 - fVar254) * 0.33333334) * fVar103;
  fStack_3a0 = (fVar173 - (fVar309 - fVar296) * 0.33333334) * fVar214 +
               (fVar165 - (fVar104 - fVar239) * 0.33333334) * fVar103;
  fStack_39c = (fVar175 - (fVar311 - fVar298) * 0.33333334) * fVar214 +
               (fVar168 - (fVar105 - fVar315) * 0.33333334) * fVar103;
  local_398 = fVar300 * fVar214 + fVar146 * fVar103;
  fStack_394 = fVar312 * fVar214 + fVar163 * fVar103;
  fStack_390 = fVar173 * fVar214 + fVar165 * fVar103;
  fStack_38c = fVar175 * fVar214 + fVar168 * fVar103;
  local_368 = fVar215 * fVar214 + fVar201 * fVar103;
  fStack_364 = fVar225 * fVar214 + fVar202 * fVar103;
  fStack_360 = fVar227 * fVar214 + fVar212 * fVar103;
  fStack_35c = fVar228 * fVar214 + fVar213 * fVar103;
  local_358 = ((fVar242 + fVar313) * 0.33333334 + fVar215) * fVar214 +
              ((fVar171 + fVar147) * 0.33333334 + fVar201) * fVar103;
  fStack_354 = ((fVar255 + fVar320) * 0.33333334 + fVar225) * fVar214 +
               ((fVar172 + fVar164) * 0.33333334 + fVar202) * fVar103;
  fStack_350 = ((fVar258 + fVar322) * 0.33333334 + fVar227) * fVar214 +
               ((fVar177 + fVar166) * 0.33333334 + fVar212) * fVar103;
  fStack_34c = ((fVar260 + fVar145) * 0.33333334 + fVar228) * fVar214 +
               ((fVar200 + fVar167) * 0.33333334 + fVar213) * fVar103;
  local_3cc.m128[1] =
       (fVar278 - (fVar316 + fVar297) * 0.33333334) * fVar214 +
       (fVar124 - (fVar226 + fVar144) * 0.33333334) * fVar103;
  local_3cc.m128[2] =
       (fVar285 - (fVar321 + fVar299) * 0.33333334) * fVar214 +
       (fVar125 - (fVar254 + fVar74) * 0.33333334) * fVar103;
  local_3cc.m128[3] =
       (fVar294 - (fVar296 + fVar309) * 0.33333334) * fVar214 +
       (fVar126 - (fVar239 + fVar104) * 0.33333334) * fVar103;
  fStack_3bc = (fVar295 - (fVar298 + fVar311) * 0.33333334) * fVar214 +
               (fVar143 - (fVar315 + fVar105) * 0.33333334) * fVar103;
  local_2b8 = fVar214 * fVar278 + fVar103 * fVar124;
  fStack_2b4 = fVar214 * fVar285 + fVar103 * fVar125;
  fStack_2b0 = fVar214 * fVar294 + fVar103 * fVar126;
  fStack_2ac = fVar214 * fVar295 + fVar103 * fVar143;
  fVar144 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar74 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar103 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar104 = (pre->ray_space).vx.field_0.m128[0];
  fVar105 = (pre->ray_space).vx.field_0.m128[1];
  fVar124 = (pre->ray_space).vy.field_0.m128[0];
  fVar125 = (pre->ray_space).vy.field_0.m128[1];
  fVar126 = (pre->ray_space).vz.field_0.m128[0];
  fVar143 = (pre->ray_space).vz.field_0.m128[1];
  local_308 = (local_378 - fVar144) * fVar104 +
              (fStack_374 - fVar74) * fVar124 + (fStack_370 - fVar103) * fVar126;
  fStack_304 = (local_378 - fVar144) * fVar105 +
               (fStack_374 - fVar74) * fVar125 + (fStack_370 - fVar103) * fVar143;
  local_208 = CONCAT44(fStack_304,local_308);
  fVar165 = (local_388 - fVar144) * fVar104 +
            (fStack_384 - fVar74) * fVar124 + (fStack_380 - fVar103) * fVar126;
  fVar168 = (local_388 - fVar144) * fVar105 +
            (fStack_384 - fVar74) * fVar125 + (fStack_380 - fVar103) * fVar143;
  local_218 = CONCAT44(fVar168,fVar165);
  fVar146 = (local_3a8 - fVar144) * fVar104 +
            (fStack_3a4 - fVar74) * fVar124 + (fStack_3a0 - fVar103) * fVar126;
  fVar163 = (local_3a8 - fVar144) * fVar105 +
            (fStack_3a4 - fVar74) * fVar125 + (fStack_3a0 - fVar103) * fVar143;
  local_228 = CONCAT44(fVar163,fVar146);
  fVar171 = (local_398 - fVar144) * fVar104 +
            (fStack_394 - fVar74) * fVar124 + (fStack_390 - fVar103) * fVar126;
  fVar172 = (local_398 - fVar144) * fVar105 +
            (fStack_394 - fVar74) * fVar125 + (fStack_390 - fVar103) * fVar143;
  local_238 = CONCAT44(fVar172,fVar171);
  fStack_300 = (local_368 - fVar144) * fVar104 +
               (fStack_364 - fVar74) * fVar124 + (fStack_360 - fVar103) * fVar126;
  fStack_2fc = (local_368 - fVar144) * fVar105 +
               (fStack_364 - fVar74) * fVar125 + (fStack_360 - fVar103) * fVar143;
  fVar177 = (local_358 - fVar144) * fVar104 +
            (fStack_354 - fVar74) * fVar124 + (fStack_350 - fVar103) * fVar126;
  fVar200 = (local_358 - fVar144) * fVar105 +
            (fStack_354 - fVar74) * fVar125 + (fStack_350 - fVar103) * fVar143;
  local_258 = CONCAT44(fVar200,fVar177);
  fVar201 = (local_3cc.m128[1] - fVar144) * fVar104 +
            (local_3cc.m128[2] - fVar74) * fVar124 + (local_3cc.m128[3] - fVar103) * fVar126;
  fVar202 = (local_3cc.m128[1] - fVar144) * fVar105 +
            (local_3cc.m128[2] - fVar74) * fVar125 + (local_3cc.m128[3] - fVar103) * fVar143;
  local_268 = CONCAT44(fVar202,fVar201);
  fVar104 = (local_2b8 - fVar144) * fVar104 +
            (fStack_2b4 - fVar74) * fVar124 + (fStack_2b0 - fVar103) * fVar126;
  fVar74 = (local_2b8 - fVar144) * fVar105 +
           (fStack_2b4 - fVar74) * fVar125 + (fStack_2b0 - fVar103) * fVar143;
  local_278 = CONCAT44(fVar74,fVar104);
  register0x00001308 = local_258;
  local_318 = local_218;
  register0x000012c8 = local_278;
  local_b8 = local_238;
  auVar95._8_4_ = fStack_300;
  auVar95._0_8_ = local_208;
  auVar95._12_4_ = fStack_2fc;
  auVar75 = minps(auVar95,_local_318);
  auVar117._8_4_ = fVar201;
  auVar117._0_8_ = local_228;
  auVar117._12_4_ = fVar202;
  auVar128 = minps(auVar117,_local_b8);
  auVar75 = minps(auVar75,auVar128);
  auVar118._4_4_ = fStack_304;
  auVar118._0_4_ = local_308;
  auVar118._8_4_ = fStack_300;
  auVar118._12_4_ = fStack_2fc;
  auVar128 = maxps(auVar118,_local_318);
  auVar129._4_4_ = fVar163;
  auVar129._0_4_ = fVar146;
  auVar129._8_4_ = fVar201;
  auVar129._12_4_ = fVar202;
  auVar130 = maxps(auVar129,_local_b8);
  auVar119 = maxps(auVar128,auVar130);
  auVar23._4_8_ = auVar130._8_8_;
  auVar23._0_4_ = auVar75._4_4_;
  auVar131._0_8_ = auVar23._0_8_ << 0x20;
  auVar131._8_4_ = auVar75._8_4_;
  auVar131._12_4_ = auVar75._12_4_;
  auVar132._8_8_ = auVar75._8_8_;
  auVar132._0_8_ = auVar131._8_8_;
  auVar128 = minps(auVar75,auVar132);
  auVar24._4_8_ = auVar75._8_8_;
  auVar24._0_4_ = auVar119._4_4_;
  auVar133._0_8_ = auVar24._0_8_ << 0x20;
  auVar133._8_4_ = auVar119._8_4_;
  auVar133._12_4_ = auVar119._12_4_;
  auVar134._8_8_ = auVar119._8_8_;
  auVar134._0_8_ = auVar133._8_8_;
  auVar75 = maxps(auVar119,auVar134);
  auVar96._0_8_ = auVar128._0_8_ & 0x7fffffff7fffffff;
  auVar96._8_4_ = auVar128._8_4_ & 0x7fffffff;
  auVar96._12_4_ = auVar128._12_4_ & 0x7fffffff;
  auVar120._0_8_ = auVar75._0_8_ & 0x7fffffff7fffffff;
  auVar120._8_4_ = auVar75._8_4_ & 0x7fffffff;
  auVar120._12_4_ = auVar75._12_4_ & 0x7fffffff;
  auVar75 = maxps(auVar96,auVar120);
  fVar144 = auVar75._4_4_;
  if (auVar75._4_4_ <= auVar75._0_4_) {
    fVar144 = auVar75._0_4_;
  }
  auVar65 = (undefined1  [8])((ulong)uVar68 + 0xf);
  fVar144 = fVar144 * 9.536743e-07;
  uStack_200 = local_208;
  uStack_210 = local_218;
  uStack_220 = local_228;
  uStack_230 = local_238;
  local_248 = CONCAT44(fStack_2fc,fStack_300);
  uStack_240 = CONCAT44(fStack_2fc,fStack_300);
  uStack_250 = local_258;
  uStack_260 = local_268;
  uStack_270 = local_278;
  local_148 = fVar144;
  fStack_144 = fVar144;
  fStack_140 = fVar144;
  fStack_13c = fVar144;
  local_158 = -fVar144;
  fStack_154 = -fVar144;
  fStack_150 = -fVar144;
  fStack_14c = -fVar144;
  local_88 = fVar165 - local_308;
  fStack_84 = fVar168 - fStack_304;
  fStack_80 = fVar177 - fStack_300;
  fStack_7c = fVar200 - fStack_2fc;
  local_98 = fVar146 - fVar165;
  fStack_94 = fVar163 - fVar168;
  fStack_90 = fVar201 - fVar177;
  fStack_8c = fVar202 - fVar200;
  local_a8 = fVar171 - fVar146;
  fStack_a4 = fVar172 - fVar163;
  fStack_a0 = fVar104 - fVar201;
  fStack_9c = fVar74 - fVar202;
  local_178 = local_368 - local_378;
  fStack_174 = fStack_364 - fStack_374;
  fStack_170 = fStack_360 - fStack_370;
  fStack_16c = fStack_35c - fStack_36c;
  local_188 = local_358 - local_388;
  fStack_184 = fStack_354 - fStack_384;
  fStack_180 = fStack_350 - fStack_380;
  fStack_17c = fStack_34c - fStack_37c;
  local_198 = local_3cc.m128[1] - local_3a8;
  fStack_194 = local_3cc.m128[2] - fStack_3a4;
  fStack_190 = local_3cc.m128[3] - fStack_3a0;
  fStack_18c = fStack_3bc - fStack_39c;
  local_1a8 = local_2b8 - local_398;
  fStack_1a4 = fStack_2b4 - fStack_394;
  fStack_1a0 = fStack_2b0 - fStack_390;
  fStack_19c = fStack_2ac - fStack_38c;
  uVar58 = 0;
  local_428 = 0x3f80000000000000;
  local_408 = 0x3f80000000000000;
  local_328 = local_228;
  uStack_320 = local_268;
  do {
    fVar74 = 1.0 - (float)local_428;
    fVar103 = 1.0 - (float)local_428;
    fVar104 = 1.0 - local_428._4_4_;
    fVar105 = 1.0 - local_428._4_4_;
    fVar124 = (float)local_208 * fVar74 + (float)local_248 * (float)local_428;
    fVar171 = local_208._4_4_ * fVar103 + local_248._4_4_ * (float)local_428;
    fVar172 = (float)uStack_200 * fVar104 + (float)uStack_240 * local_428._4_4_;
    fVar177 = uStack_200._4_4_ * fVar105 + uStack_240._4_4_ * local_428._4_4_;
    fVar163 = (float)local_218 * fVar74 + (float)local_258 * (float)local_428;
    fVar213 = local_218._4_4_ * fVar103 + local_258._4_4_ * (float)local_428;
    fVar214 = (float)uStack_210 * fVar104 + (float)uStack_250 * local_428._4_4_;
    fVar224 = uStack_210._4_4_ * fVar105 + uStack_250._4_4_ * local_428._4_4_;
    fVar226 = (float)local_228 * fVar74 + (float)local_268 * (float)local_428;
    fVar241 = local_228._4_4_ * fVar103 + local_268._4_4_ * (float)local_428;
    fVar254 = (float)uStack_220 * fVar104 + (float)uStack_260 * local_428._4_4_;
    fVar257 = uStack_220._4_4_ * fVar105 + uStack_260._4_4_ * local_428._4_4_;
    fVar294 = fVar74 * (float)local_238 + (float)local_428 * (float)local_278;
    fVar295 = fVar103 * local_238._4_4_ + (float)local_428 * local_278._4_4_;
    fVar297 = fVar104 * (float)uStack_230 + local_428._4_4_ * (float)uStack_270;
    fVar299 = fVar105 * uStack_230._4_4_ + local_428._4_4_ * uStack_270._4_4_;
    fVar74 = (local_408._4_4_ - (float)local_408) * 0.11111111;
    fVar315 = (local_408._4_4_ - (float)local_408) * 0.0 + (float)local_408;
    fVar229 = (local_408._4_4_ - (float)local_408) * 0.33333334 + (float)local_408;
    fVar239 = (local_408._4_4_ - (float)local_408) * 0.6666667 + (float)local_408;
    fVar240 = (local_408._4_4_ - (float)local_408) * 1.0 + (float)local_408;
    fVar262 = 1.0 - fVar315;
    fVar274 = 1.0 - fVar229;
    fVar278 = 1.0 - fVar239;
    fVar285 = 1.0 - fVar240;
    fVar125 = fVar163 * fVar262 + fVar226 * fVar315;
    fVar126 = fVar163 * fVar274 + fVar226 * fVar229;
    fVar143 = fVar163 * fVar278 + fVar226 * fVar239;
    fVar146 = fVar163 * fVar285 + fVar226 * fVar240;
    fVar200 = fVar213 * fVar262 + fVar241 * fVar315;
    fVar201 = fVar213 * fVar274 + fVar241 * fVar229;
    fVar202 = fVar213 * fVar278 + fVar241 * fVar239;
    fVar212 = fVar213 * fVar285 + fVar241 * fVar240;
    fVar103 = (fVar124 * fVar262 + fVar163 * fVar315) * fVar262 + fVar315 * fVar125;
    fVar104 = (fVar124 * fVar274 + fVar163 * fVar229) * fVar274 + fVar229 * fVar126;
    fVar105 = (fVar124 * fVar278 + fVar163 * fVar239) * fVar278 + fVar239 * fVar143;
    fVar124 = (fVar124 * fVar285 + fVar163 * fVar240) * fVar285 + fVar240 * fVar146;
    fVar163 = (fVar171 * fVar262 + fVar213 * fVar315) * fVar262 + fVar315 * fVar200;
    fVar165 = (fVar171 * fVar274 + fVar213 * fVar229) * fVar274 + fVar229 * fVar201;
    fVar168 = (fVar171 * fVar278 + fVar213 * fVar239) * fVar278 + fVar239 * fVar202;
    fVar171 = (fVar171 * fVar285 + fVar213 * fVar240) * fVar285 + fVar240 * fVar212;
    fVar125 = fVar125 * fVar262 + (fVar226 * fVar262 + fVar294 * fVar315) * fVar315;
    fVar126 = fVar126 * fVar274 + (fVar226 * fVar274 + fVar294 * fVar229) * fVar229;
    fVar143 = fVar143 * fVar278 + (fVar226 * fVar278 + fVar294 * fVar239) * fVar239;
    fVar146 = fVar146 * fVar285 + (fVar226 * fVar285 + fVar294 * fVar240) * fVar240;
    fVar200 = fVar200 * fVar262 + (fVar241 * fVar262 + fVar295 * fVar315) * fVar315;
    fVar201 = fVar201 * fVar274 + (fVar241 * fVar274 + fVar295 * fVar229) * fVar229;
    fVar202 = fVar202 * fVar278 + (fVar241 * fVar278 + fVar295 * fVar239) * fVar239;
    fVar212 = fVar212 * fVar285 + (fVar241 * fVar285 + fVar295 * fVar240) * fVar240;
    local_2a8 = fVar262 * fVar103 + fVar315 * fVar125;
    fStack_2a4 = fVar274 * fVar104 + fVar229 * fVar126;
    fStack_2a0 = fVar278 * fVar105 + fVar239 * fVar143;
    fStack_29c = fVar285 * fVar124 + fVar240 * fVar146;
    local_298 = fVar262 * fVar163 + fVar315 * fVar200;
    fStack_294 = fVar274 * fVar165 + fVar229 * fVar201;
    fStack_290 = fVar278 * fVar168 + fVar239 * fVar202;
    fStack_28c = fVar285 * fVar171 + fVar240 * fVar212;
    fVar126 = (fVar126 - fVar104) * 3.0 * fVar74;
    fVar105 = (fVar143 - fVar105) * 3.0 * fVar74;
    fVar124 = (fVar146 - fVar124) * 3.0 * fVar74;
    fVar143 = (fVar201 - fVar165) * 3.0 * fVar74;
    fVar146 = (fVar202 - fVar168) * 3.0 * fVar74;
    fVar165 = (fVar212 - fVar171) * 3.0 * fVar74;
    local_e8._4_4_ = fStack_2a0;
    local_e8._0_4_ = fStack_2a4;
    local_c8._4_4_ = fStack_290;
    local_c8._0_4_ = fStack_294;
    local_3b8._0_4_ = local_2a8 + (fVar125 - fVar103) * 3.0 * fVar74;
    local_3b8._4_4_ = fStack_2a4 + fVar126;
    uStack_3b0._0_4_ = fStack_2a0 + fVar105;
    uStack_3b0._4_4_ = fStack_29c + fVar124;
    fVar103 = local_298 + (fVar200 - fVar163) * 3.0 * fVar74;
    fVar104 = fStack_294 + fVar143;
    fStack_410 = fStack_290 + fVar146;
    fStack_40c = fStack_28c + fVar165;
    local_288._0_4_ = fStack_2a4 - fVar126;
    local_288._4_4_ = fStack_2a0 - fVar105;
    local_288._8_4_ = fStack_29c - fVar124;
    local_288._12_4_ = 0;
    local_c8._8_4_ = fStack_28c;
    local_c8._12_4_ = 0;
    local_d8._0_4_ = fStack_294 - fVar143;
    local_d8._4_4_ = fStack_290 - fVar146;
    local_d8._8_4_ = fStack_28c - fVar165;
    local_d8._12_4_ = 0;
    fVar105 = fVar214 * fVar262 + fVar254 * fVar315;
    fVar124 = fVar214 * fVar274 + fVar254 * fVar229;
    fVar125 = fVar214 * fVar278 + fVar254 * fVar239;
    fVar126 = fVar214 * fVar285 + fVar254 * fVar240;
    fVar143 = fVar224 * fVar262 + fVar257 * fVar315;
    fVar146 = fVar224 * fVar274 + fVar257 * fVar229;
    fVar163 = fVar224 * fVar278 + fVar257 * fVar239;
    fVar165 = fVar224 * fVar285 + fVar257 * fVar240;
    fVar200 = (fVar172 * fVar262 + fVar214 * fVar315) * fVar262 + fVar315 * fVar105;
    fVar201 = (fVar172 * fVar274 + fVar214 * fVar229) * fVar274 + fVar229 * fVar124;
    fVar202 = (fVar172 * fVar278 + fVar214 * fVar239) * fVar278 + fVar239 * fVar125;
    fVar212 = (fVar172 * fVar285 + fVar214 * fVar240) * fVar285 + fVar240 * fVar126;
    fVar168 = (fVar177 * fVar262 + fVar224 * fVar315) * fVar262 + fVar315 * fVar143;
    fVar171 = (fVar177 * fVar274 + fVar224 * fVar229) * fVar274 + fVar229 * fVar146;
    fVar172 = (fVar177 * fVar278 + fVar224 * fVar239) * fVar278 + fVar239 * fVar163;
    fVar177 = (fVar177 * fVar285 + fVar224 * fVar240) * fVar285 + fVar240 * fVar165;
    fVar105 = fVar105 * fVar262 + (fVar254 * fVar262 + fVar297 * fVar315) * fVar315;
    fVar124 = fVar124 * fVar274 + (fVar254 * fVar274 + fVar297 * fVar229) * fVar229;
    fVar125 = fVar125 * fVar278 + (fVar254 * fVar278 + fVar297 * fVar239) * fVar239;
    fVar126 = fVar126 * fVar285 + (fVar254 * fVar285 + fVar297 * fVar240) * fVar240;
    fVar213 = fVar143 * fVar262 + (fVar257 * fVar262 + fVar299 * fVar315) * fVar315;
    fVar214 = fVar146 * fVar274 + (fVar257 * fVar274 + fVar299 * fVar229) * fVar229;
    fVar224 = fVar163 * fVar278 + (fVar257 * fVar278 + fVar299 * fVar239) * fVar239;
    fVar226 = fVar165 * fVar285 + (fVar257 * fVar285 + fVar299 * fVar240) * fVar240;
    fVar143 = fVar262 * fVar200 + fVar315 * fVar105;
    fVar146 = fVar274 * fVar201 + fVar229 * fVar124;
    fVar163 = fVar278 * fVar202 + fVar239 * fVar125;
    fVar165 = fVar285 * fVar212 + fVar240 * fVar126;
    fVar241 = fVar262 * fVar168 + fVar315 * fVar213;
    fVar254 = fVar274 * fVar171 + fVar229 * fVar214;
    fVar257 = fVar278 * fVar172 + fVar239 * fVar224;
    fVar315 = fVar285 * fVar177 + fVar240 * fVar226;
    fVar124 = (fVar124 - fVar201) * 3.0 * fVar74;
    fVar125 = (fVar125 - fVar202) * 3.0 * fVar74;
    fVar126 = (fVar126 - fVar212) * 3.0 * fVar74;
    fVar171 = (fVar214 - fVar171) * 3.0 * fVar74;
    fVar172 = (fVar224 - fVar172) * 3.0 * fVar74;
    fVar177 = (fVar226 - fVar177) * 3.0 * fVar74;
    local_f8._4_4_ = fVar163;
    local_f8._0_4_ = fVar146;
    local_f8._8_4_ = fVar165;
    local_f8._12_4_ = 0;
    local_118._4_4_ = fVar257;
    local_118._0_4_ = fVar254;
    local_118._8_4_ = fVar315;
    local_118._12_4_ = 0;
    local_338 = fVar143 + (fVar105 - fVar200) * 3.0 * fVar74;
    fStack_334 = fVar146 + fVar124;
    fStack_330 = fVar163 + fVar125;
    fStack_32c = fVar165 + fVar126;
    local_108 = fVar241 + (fVar213 - fVar168) * 3.0 * fVar74;
    fStack_104 = fVar254 + fVar171;
    fStack_100 = fVar257 + fVar172;
    fStack_fc = fVar315 + fVar177;
    local_138._0_4_ = fVar146 - fVar124;
    local_138._4_4_ = fVar163 - fVar125;
    local_138._8_4_ = fVar165 - fVar126;
    local_138._12_4_ = 0;
    local_128._0_4_ = fVar254 - fVar171;
    local_128._4_4_ = fVar257 - fVar172;
    local_128._8_4_ = fVar315 - fVar177;
    local_128._12_4_ = 0;
    local_e8._8_4_ = fStack_29c;
    local_e8._12_4_ = 0;
    fVar126 = (fVar146 - fStack_2a4) + (fVar143 - local_2a8);
    fVar168 = (fVar163 - fStack_2a0) + (fVar146 - fStack_2a4);
    fVar171 = (fVar165 - fStack_29c) + (fVar163 - fStack_2a0);
    fVar172 = (fVar165 - fStack_29c) + 0.0;
    fVar74 = (fVar254 - fStack_294) + (fVar241 - local_298);
    fVar105 = (fVar257 - fStack_290) + (fVar254 - fStack_294);
    fVar124 = (fVar315 - fStack_28c) + (fVar257 - fStack_290);
    fVar125 = (fVar315 - fStack_28c) + 0.0;
    auVar194._0_8_ =
         CONCAT44(fStack_294 * fVar168 - fStack_2a4 * fVar105,
                  local_298 * fVar126 - local_2a8 * fVar74);
    auVar194._8_4_ = fStack_290 * fVar171 - fStack_2a0 * fVar124;
    auVar194._12_4_ = fStack_28c * fVar172 - fStack_29c * fVar125;
    auVar135._0_4_ = fVar103 * fVar126 - (float)local_3b8._0_4_ * fVar74;
    auVar135._4_4_ = fVar104 * fVar168 - (float)local_3b8._4_4_ * fVar105;
    auVar135._8_4_ = fStack_410 * fVar171 - (float)uStack_3b0 * fVar124;
    auVar135._12_4_ = fStack_40c * fVar172 - uStack_3b0._4_4_ * fVar125;
    auVar153._0_8_ =
         CONCAT44(local_d8._4_4_ * fVar168 - fVar105 * local_288._4_4_,
                  local_d8._0_4_ * fVar126 - fVar74 * local_288._0_4_);
    auVar153._8_4_ = local_d8._8_4_ * fVar171 - fVar124 * local_288._8_4_;
    auVar153._12_4_ = fVar172 * 0.0 - fVar125 * 0.0;
    auVar330._0_4_ = fVar126 * fStack_294 - fVar74 * fStack_2a4;
    auVar330._4_4_ = fVar168 * fStack_290 - fVar105 * fStack_2a0;
    auVar330._8_4_ = fVar171 * fStack_28c - fVar124 * fStack_29c;
    auVar330._12_4_ = fVar172 * 0.0 - fVar125 * 0.0;
    auVar97._0_8_ =
         CONCAT44(fVar254 * fVar168 - fVar146 * fVar105,fVar241 * fVar126 - fVar143 * fVar74);
    auVar97._8_4_ = fVar257 * fVar171 - fVar163 * fVar124;
    auVar97._12_4_ = fVar315 * fVar172 - fVar165 * fVar125;
    auVar291._0_4_ = local_108 * fVar126 - local_338 * fVar74;
    auVar291._4_4_ = fStack_104 * fVar168 - fStack_334 * fVar105;
    auVar291._8_4_ = fStack_100 * fVar171 - fStack_330 * fVar124;
    auVar291._12_4_ = fStack_fc * fVar172 - fStack_32c * fVar125;
    auVar230._0_8_ =
         CONCAT44(local_128._4_4_ * fVar168 - fVar105 * local_138._4_4_,
                  local_128._0_4_ * fVar126 - fVar74 * local_138._0_4_);
    auVar230._8_4_ = local_128._8_4_ * fVar171 - fVar124 * local_138._8_4_;
    auVar230._12_4_ = fVar172 * 0.0 - fVar125 * 0.0;
    auVar270._0_4_ = fVar126 * fVar254 - fVar74 * fVar146;
    auVar270._4_4_ = fVar168 * fVar257 - fVar105 * fVar163;
    auVar270._8_4_ = fVar171 * fVar315 - fVar124 * fVar165;
    auVar270._12_4_ = fVar172 * 0.0 - fVar125 * 0.0;
    auVar323._8_4_ = auVar194._8_4_;
    auVar323._0_8_ = auVar194._0_8_;
    auVar323._12_4_ = auVar194._12_4_;
    auVar119 = minps(auVar323,auVar135);
    auVar128 = maxps(auVar194,auVar135);
    auVar136._8_4_ = auVar153._8_4_;
    auVar136._0_8_ = auVar153._0_8_;
    auVar136._12_4_ = auVar153._12_4_;
    auVar75 = minps(auVar136,auVar330);
    auVar324 = minps(auVar119,auVar75);
    auVar75 = maxps(auVar153,auVar330);
    auVar130 = maxps(auVar128,auVar75);
    auVar137._8_4_ = auVar97._8_4_;
    auVar137._0_8_ = auVar97._0_8_;
    auVar137._12_4_ = auVar97._12_4_;
    auVar128 = minps(auVar137,auVar291);
    auVar75 = maxps(auVar97,auVar291);
    auVar154._8_4_ = auVar230._8_4_;
    auVar154._0_8_ = auVar230._0_8_;
    auVar154._12_4_ = auVar230._12_4_;
    auVar119 = minps(auVar154,auVar270);
    auVar128 = minps(auVar128,auVar119);
    auVar119 = minps(auVar324,auVar128);
    auVar128 = maxps(auVar230,auVar270);
    auVar75 = maxps(auVar75,auVar128);
    auVar75 = maxps(auVar130,auVar75);
    bVar67 = auVar119._4_4_ <= fStack_144;
    bVar21 = auVar119._8_4_ <= fStack_140;
    bVar22 = auVar119._12_4_ <= fStack_13c;
    auVar55._4_4_ = -(uint)bVar21;
    auVar55._0_4_ = -(uint)bVar67;
    auVar55._8_4_ = -(uint)bVar22;
    auVar55._12_4_ = 0;
    auVar326 = auVar55 << 0x20;
    auVar195._0_4_ =
         -(uint)(local_158 <= auVar75._0_4_ && auVar119._0_4_ <= local_148) & local_168._0_4_;
    auVar195._4_4_ = -(uint)(fStack_154 <= auVar75._4_4_ && bVar67) & local_168._4_4_;
    auVar195._8_4_ = -(uint)(fStack_150 <= auVar75._8_4_ && bVar21) & local_168._8_4_;
    auVar195._12_4_ = -(uint)(fStack_14c <= auVar75._12_4_ && bVar22) & local_168._12_4_;
    iVar61 = movmskps((int)pRVar62,auVar195);
    paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0;
    if (iVar61 != 0) {
      fVar126 = (fVar146 - fVar143) + (fStack_2a4 - local_2a8);
      fVar168 = (fVar163 - fVar146) + (fStack_2a0 - fStack_2a4);
      fVar171 = (fVar165 - fVar163) + (fStack_29c - fStack_2a0);
      fVar172 = (0.0 - fVar165) + (0.0 - fStack_29c);
      fVar74 = (fVar254 - fVar241) + (fStack_294 - local_298);
      fVar105 = (fVar257 - fVar254) + (fStack_290 - fStack_294);
      fVar124 = (fVar315 - fVar257) + (fStack_28c - fStack_290);
      fVar125 = (0.0 - fVar315) + (0.0 - fStack_28c);
      auVar331._0_8_ =
           CONCAT44(fStack_294 * fVar168 - fStack_2a4 * fVar105,
                    local_298 * fVar126 - local_2a8 * fVar74);
      auVar331._8_4_ = fStack_290 * fVar171 - fStack_2a0 * fVar124;
      auVar331._12_4_ = fStack_28c * fVar172 - fStack_29c * fVar125;
      auVar138._0_4_ = fVar103 * fVar126 - (float)local_3b8._0_4_ * fVar74;
      auVar138._4_4_ = fVar104 * fVar168 - (float)local_3b8._4_4_ * fVar105;
      auVar138._8_4_ = fStack_410 * fVar171 - (float)uStack_3b0 * fVar124;
      auVar138._12_4_ = fStack_40c * fVar172 - uStack_3b0._4_4_ * fVar125;
      auVar326._0_4_ = local_288._0_4_ * fVar74;
      auVar326._4_4_ = local_288._4_4_ * fVar105;
      auVar326._8_4_ = local_288._8_4_ * fVar124;
      auVar326._12_4_ = fVar125 * 0.0;
      auVar221._0_8_ =
           CONCAT44(local_d8._4_4_ * fVar168 - auVar326._4_4_,
                    local_d8._0_4_ * fVar126 - auVar326._0_4_);
      auVar221._8_4_ = local_d8._8_4_ * fVar171 - auVar326._8_4_;
      auVar221._12_4_ = fVar172 * 0.0 - auVar326._12_4_;
      auVar155._0_4_ = fStack_294 * fVar126 - fStack_2a4 * fVar74;
      auVar155._4_4_ = fStack_290 * fVar168 - fStack_2a0 * fVar105;
      auVar155._8_4_ = fStack_28c * fVar171 - fStack_29c * fVar124;
      auVar155._12_4_ = fVar172 * 0.0 - fVar125 * 0.0;
      auVar317._0_8_ =
           CONCAT44(fVar254 * fVar168 - fVar146 * fVar105,fVar241 * fVar126 - fVar143 * fVar74);
      auVar317._8_4_ = fVar257 * fVar171 - fVar163 * fVar124;
      auVar317._12_4_ = fVar315 * fVar172 - fVar165 * fVar125;
      auVar169._0_4_ = local_108 * fVar126 - local_338 * fVar74;
      auVar169._4_4_ = fStack_104 * fVar168 - fStack_334 * fVar105;
      auVar169._8_4_ = fStack_100 * fVar171 - fStack_330 * fVar124;
      auVar169._12_4_ = fStack_fc * fVar172 - fStack_32c * fVar125;
      auVar292._0_8_ =
           CONCAT44(local_128._4_4_ * fVar168 - local_138._4_4_ * fVar105,
                    local_128._0_4_ * fVar126 - local_138._0_4_ * fVar74);
      auVar292._8_4_ = local_128._8_4_ * fVar171 - local_138._8_4_ * fVar124;
      auVar292._12_4_ = fVar172 * 0.0 - fVar125 * 0.0;
      auVar271._0_4_ = fVar126 * fVar254 - fVar74 * fVar146;
      auVar271._4_4_ = fVar168 * fVar257 - fVar105 * fVar163;
      auVar271._8_4_ = fVar171 * fVar315 - fVar124 * fVar165;
      auVar271._12_4_ = fVar172 * 0.0 - fVar125 * 0.0;
      auVar98._8_4_ = auVar331._8_4_;
      auVar98._0_8_ = auVar331._0_8_;
      auVar98._12_4_ = auVar331._12_4_;
      auVar75 = minps(auVar98,auVar138);
      auVar119 = maxps(auVar331,auVar138);
      auVar139._8_4_ = auVar221._8_4_;
      auVar139._0_8_ = auVar221._0_8_;
      auVar139._12_4_ = auVar221._12_4_;
      auVar128 = minps(auVar139,auVar155);
      auVar75 = minps(auVar75,auVar128);
      auVar128 = maxps(auVar221,auVar155);
      auVar324 = maxps(auVar119,auVar128);
      auVar140._8_4_ = auVar317._8_4_;
      auVar140._0_8_ = auVar317._0_8_;
      auVar140._12_4_ = auVar317._12_4_;
      auVar128 = minps(auVar140,auVar169);
      auVar130 = maxps(auVar317,auVar169);
      auVar156._8_4_ = auVar292._8_4_;
      auVar156._0_8_ = auVar292._0_8_;
      auVar156._12_4_ = auVar292._12_4_;
      auVar119 = minps(auVar156,auVar271);
      auVar128 = minps(auVar128,auVar119);
      auVar75 = minps(auVar75,auVar128);
      auVar128 = maxps(auVar292,auVar271);
      auVar128 = maxps(auVar130,auVar128);
      auVar128 = maxps(auVar324,auVar128);
      auVar332._0_4_ =
           -(uint)(local_158 <= auVar128._0_4_ && auVar75._0_4_ <= local_148) & auVar195._0_4_;
      auVar332._4_4_ =
           -(uint)(fStack_154 <= auVar128._4_4_ && auVar75._4_4_ <= fStack_144) & auVar195._4_4_;
      auVar332._8_4_ =
           -(uint)(fStack_150 <= auVar128._8_4_ && auVar75._8_4_ <= fStack_140) & auVar195._8_4_;
      auVar332._12_4_ =
           -(uint)(fStack_14c <= auVar128._12_4_ && auVar75._12_4_ <= fStack_13c) & auVar195._12_4_;
      uVar71 = movmskps(0,auVar332);
      paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar71;
    }
    if ((uint)paVar59 != 0) {
      auStack_1f8[uVar58] = (uint)paVar59;
      *(undefined8 *)(afStack_78 + uVar58 * 2) = local_408;
      auStack_58[uVar58] = local_428;
      uVar58 = (ulong)((int)uVar58 + 1);
    }
    do {
      if ((int)uVar58 == 0) {
        fVar144 = (ray->super_RayK<1>).tfar;
        auVar123._4_4_ = -(uint)(fStack_1b4 <= fVar144);
        auVar123._0_4_ = -(uint)(local_1b8 <= fVar144);
        auVar123._8_4_ = -(uint)(fStack_1b0 <= fVar144);
        auVar123._12_4_ = -(uint)(fStack_1ac <= fVar144);
        uVar69 = movmskps((int)paVar59,auVar123);
        uVar68 = uVar68 & SUB84(auVar65,0) & uVar69;
        if (uVar68 == 0) {
          return;
        }
        goto LAB_00beef62;
      }
      uVar72 = (int)uVar58 - 1;
      uVar60 = (ulong)uVar72;
      uVar71 = auStack_1f8[uVar60];
      local_428 = auStack_58[uVar60];
      uVar5 = 0;
      if (uVar71 != 0) {
        for (; (uVar71 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar71 = uVar71 - 1 & uVar71;
      auStack_1f8[uVar60] = uVar71;
      if (uVar71 == 0) {
        uVar58 = (ulong)uVar72;
      }
      pRVar63 = (RTCIntersectArguments *)(uVar5 + 1);
      pRVar62 = pRVar63;
      if ((long)pRVar63 < 0) {
        pRVar62 = (RTCIntersectArguments *)((ulong)((uint)pRVar63 & 1) | (ulong)pRVar63 >> 1);
      }
      fVar74 = afStack_78[uVar60 * 2];
      fVar103 = *(float *)((long)auStack_58 + uVar60 * 8 + -0x1c);
      fVar104 = fVar74 * (1.0 - (float)uVar5 * 0.33333334) + fVar103 * (float)uVar5 * 0.33333334;
      fVar105 = fVar74 * (1.0 - (float)pRVar63 * 0.33333334) + fVar103 * (float)pRVar63 * 0.33333334
      ;
      fVar124 = fVar74 * 0.0 + fVar103 * 0.0;
      fVar103 = fVar74 * 0.0 + fVar103 * 0.0;
      fVar74 = fVar105 - fVar104;
      local_408 = CONCAT44(fVar105,fVar104);
      if (0.16666667 <= fVar74) break;
      fVar168 = (float)local_428;
      fVar172 = (float)((ulong)local_428 >> 0x20);
      fVar125 = 1.0 - fVar168;
      fVar126 = 1.0 - fVar168;
      fVar200 = 1.0 - fVar172;
      fVar201 = 1.0 - fVar172;
      fVar143 = (float)local_208 * fVar125 + (float)local_248 * fVar168;
      fVar146 = local_208._4_4_ * fVar126 + local_248._4_4_ * fVar168;
      fVar163 = (float)uStack_200 * fVar200 + (float)uStack_240 * fVar172;
      fVar165 = uStack_200._4_4_ * fVar201 + uStack_240._4_4_ * fVar172;
      fVar212 = (float)local_218 * fVar125 + (float)local_258 * fVar168;
      fVar213 = local_218._4_4_ * fVar126 + local_258._4_4_ * fVar168;
      fVar224 = (float)uStack_210 * fVar200 + (float)uStack_250 * fVar172;
      fVar226 = uStack_210._4_4_ * fVar201 + uStack_250._4_4_ * fVar172;
      fVar241 = (float)local_228 * fVar125 + (float)local_268 * fVar168;
      fVar257 = local_228._4_4_ * fVar126 + local_268._4_4_ * fVar168;
      fVar229 = (float)uStack_220 * fVar200 + (float)uStack_260 * fVar172;
      fVar240 = uStack_220._4_4_ * fVar201 + uStack_260._4_4_ * fVar172;
      fVar171 = (fVar125 * (float)local_238 + fVar168 * (float)local_278) - fVar241;
      fVar177 = (fVar126 * local_238._4_4_ + fVar168 * local_278._4_4_) - fVar257;
      fVar202 = (fVar200 * (float)uStack_230 + fVar172 * (float)uStack_270) - fVar229;
      fVar214 = (fVar201 * uStack_230._4_4_ + fVar172 * uStack_270._4_4_) - fVar240;
      fVar125 = fVar104 * (fVar241 - fVar212) + fVar212;
      fVar126 = fVar104 * (fVar257 - fVar213) + fVar213;
      fVar200 = fVar104 * (fVar229 - fVar224) + fVar224;
      fVar201 = fVar104 * (fVar240 - fVar226) + fVar226;
      fVar254 = (fVar241 - fVar212) * fVar105 + fVar212;
      fVar315 = (fVar257 - fVar213) * fVar105 + fVar213;
      fVar239 = (fVar229 - fVar224) * fVar105 + fVar224;
      fVar262 = (fVar240 - fVar226) * fVar105 + fVar226;
      fVar274 = fVar104 * (fVar212 - fVar143) + fVar143;
      fVar278 = fVar104 * (fVar213 - fVar146) + fVar146;
      fVar285 = fVar104 * (fVar224 - fVar163) + fVar163;
      fVar294 = fVar104 * (fVar226 - fVar165) + fVar165;
      fVar274 = (fVar125 - fVar274) * fVar104 + fVar274;
      fVar278 = (fVar126 - fVar278) * fVar104 + fVar278;
      fVar285 = (fVar200 - fVar285) * fVar104 + fVar285;
      fVar294 = (fVar201 - fVar294) * fVar104 + fVar294;
      fVar125 = (((fVar104 * fVar171 + fVar241) - fVar125) * fVar104 + fVar125) - fVar274;
      fVar126 = (((fVar104 * fVar177 + fVar257) - fVar126) * fVar104 + fVar126) - fVar278;
      fVar200 = (((fVar104 * fVar202 + fVar229) - fVar200) * fVar104 + fVar200) - fVar285;
      fVar201 = (((fVar104 * fVar214 + fVar240) - fVar201) * fVar104 + fVar201) - fVar294;
      auVar99._0_4_ = fVar104 * fVar125 + fVar274;
      auVar99._4_4_ = fVar104 * fVar126 + fVar278;
      auVar99._8_4_ = fVar104 * fVar200 + fVar285;
      auVar99._12_4_ = fVar104 * fVar201 + fVar294;
      fVar143 = (fVar212 - fVar143) * fVar105 + fVar143;
      fVar146 = (fVar213 - fVar146) * fVar105 + fVar146;
      fVar163 = (fVar224 - fVar163) * fVar105 + fVar163;
      fVar165 = (fVar226 - fVar165) * fVar105 + fVar165;
      fVar143 = (fVar254 - fVar143) * fVar105 + fVar143;
      fVar146 = (fVar315 - fVar146) * fVar105 + fVar146;
      fVar163 = (fVar239 - fVar163) * fVar105 + fVar163;
      fVar165 = (fVar262 - fVar165) * fVar105 + fVar165;
      fVar104 = (((fVar171 * fVar105 + fVar241) - fVar254) * fVar105 + fVar254) - fVar143;
      fVar212 = (((fVar177 * fVar105 + fVar257) - fVar315) * fVar105 + fVar315) - fVar146;
      fVar213 = (((fVar202 * fVar105 + fVar229) - fVar239) * fVar105 + fVar239) - fVar163;
      fVar214 = (((fVar214 * fVar105 + fVar240) - fVar262) * fVar105 + fVar262) - fVar165;
      fVar143 = fVar105 * fVar104 + fVar143;
      fVar146 = fVar105 * fVar212 + fVar146;
      fVar163 = fVar105 * fVar213 + fVar163;
      fVar165 = fVar105 * fVar214 + fVar165;
      fVar105 = fVar74 * 0.33333334;
      fVar171 = fVar125 * 3.0 * fVar105 + auVar99._0_4_;
      fVar177 = fVar126 * 3.0 * fVar105 + auVar99._4_4_;
      fVar200 = fVar200 * 3.0 * fVar105 + auVar99._8_4_;
      fVar201 = fVar201 * 3.0 * fVar105 + auVar99._12_4_;
      fVar202 = fVar143 - fVar105 * fVar104 * 3.0;
      fVar212 = fVar146 - fVar105 * fVar212 * 3.0;
      fVar213 = fVar163 - fVar105 * fVar213 * 3.0;
      fVar214 = fVar165 - fVar105 * fVar214 * 3.0;
      auVar25._4_8_ = auVar326._8_8_;
      auVar25._0_4_ = auVar99._4_4_;
      auVar325._0_8_ = auVar25._0_8_ << 0x20;
      auVar325._8_4_ = auVar99._8_4_;
      auVar325._12_4_ = auVar99._12_4_;
      auVar326._8_8_ = auVar99._8_8_;
      auVar326._0_8_ = auVar325._8_8_;
      fVar254 = (fVar163 - fVar143) + (auVar99._8_4_ - auVar99._0_4_);
      fVar257 = (fVar165 - fVar146) + (auVar99._12_4_ - auVar99._4_4_);
      auVar231._0_4_ = fVar257 * fVar146;
      auVar231._4_4_ = fVar257 * fVar146;
      auVar231._8_4_ = fVar257 * fVar165;
      auVar231._12_4_ = fVar257 * fVar165;
      fVar104 = auVar99._0_4_ * fVar254 + auVar99._4_4_ * fVar257;
      fVar105 = auVar99._8_4_ * fVar254 + auVar99._12_4_ * fVar257;
      fVar315 = fVar171 * fVar254 + fVar177 * fVar257;
      fVar229 = fVar200 * fVar254 + fVar201 * fVar257;
      fVar224 = fVar202 * fVar254 + fVar212 * fVar257;
      auVar248._4_4_ = fVar212 * fVar254 + fVar212 * fVar257;
      auVar248._0_4_ = fVar224;
      fVar226 = fVar213 * fVar254 + fVar214 * fVar257;
      fVar125 = fVar254 * fVar143 + auVar231._0_4_;
      fVar241 = fVar254 * fVar163 + auVar231._8_4_;
      auVar26._4_8_ = auVar231._8_8_;
      auVar26._0_4_ = fVar177 * fVar254 + fVar177 * fVar257;
      auVar232._0_8_ = auVar26._0_8_ << 0x20;
      auVar232._8_4_ = fVar229;
      auVar232._12_4_ = fVar201 * fVar254 + fVar201 * fVar257;
      fVar126 = fVar315;
      if (fVar315 <= fVar104) {
        fVar126 = fVar104;
        fVar104 = fVar315;
      }
      auVar233._8_8_ = auVar232._8_8_;
      auVar233._0_8_ = auVar233._8_8_;
      auVar248._8_4_ = fVar226;
      auVar248._12_4_ = fVar214 * fVar254 + fVar214 * fVar257;
      if (fVar125 <= fVar224) {
        auVar248._0_4_ = fVar125;
      }
      if (auVar248._0_4_ <= fVar104) {
        fVar104 = auVar248._0_4_;
      }
      auVar27._4_8_ = auVar248._8_8_;
      auVar27._0_4_ = fVar254 * fVar146 + auVar231._4_4_;
      auVar249._0_8_ = auVar27._0_8_ << 0x20;
      auVar249._8_4_ = fVar241;
      auVar249._12_4_ = fVar254 * fVar165 + auVar231._12_4_;
      if (fVar125 <= fVar224) {
        fVar125 = fVar224;
      }
      auVar250._8_8_ = auVar249._8_8_;
      auVar250._0_8_ = auVar250._8_8_;
      if (fVar125 <= fVar126) {
        fVar125 = fVar126;
      }
      if (fVar229 <= fVar105) {
        auVar233._0_4_ = fVar105;
        fVar105 = fVar229;
      }
      fVar126 = fVar226;
      if (fVar241 <= fVar226) {
        fVar126 = fVar241;
      }
      if (fVar126 <= fVar105) {
        fVar105 = fVar126;
      }
      if (fVar241 <= fVar226) {
        auVar250._0_4_ = fVar226;
      }
      if (auVar250._0_4_ <= auVar233._0_4_) {
        auVar250._0_4_ = auVar233._0_4_;
      }
      bVar67 = 3 < (uint)uVar58;
      uVar28 = (undefined3)(uVar72 >> 8);
      fVar126 = auVar250._0_4_;
      if ((0.0001 <= fVar104) || (fVar126 <= -0.0001)) {
        if ((-0.0001 < fVar125 && fVar105 < 0.0001) ||
           ((fVar104 < 0.0001 && -0.0001 < fVar125 || (fVar105 < 0.0001 && -0.0001 < fVar126))))
        goto LAB_00bf0748;
        bVar21 = true;
        paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar28,bVar67);
        pRVar62 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar62 >> 8),fVar74 < 0.001);
      }
      else {
LAB_00bf0748:
        _local_3b8 = auVar326;
        local_408 = CONCAT44(fVar165,fVar163);
        bVar67 = bVar67 || fVar74 < 0.001;
        paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar28,bVar67);
        fVar241 = (float)(~-(uint)(fVar104 < 0.0) & 0x3f800000 | -(uint)(fVar104 < 0.0) & 0xbf800000
                         );
        fVar226 = (float)(~-(uint)(fVar125 < 0.0) & 0x3f800000 | -(uint)(fVar125 < 0.0) & 0xbf800000
                         );
        fVar224 = 0.0;
        if ((fVar241 == fVar226) && (!NAN(fVar241) && !NAN(fVar226))) {
          fVar224 = INFINITY;
        }
        fVar254 = 0.0;
        if ((fVar241 == fVar226) && (!NAN(fVar241) && !NAN(fVar226))) {
          fVar254 = -INFINITY;
        }
        fVar257 = (float)(~-(uint)(fVar105 < 0.0) & 0x3f800000 | -(uint)(fVar105 < 0.0) & 0xbf800000
                         );
        if ((fVar241 != fVar257) || (fVar315 = fVar254, NAN(fVar241) || NAN(fVar257))) {
          if ((fVar105 != fVar104) || (NAN(fVar105) || NAN(fVar104))) {
            fVar105 = -fVar104 / (fVar105 - fVar104);
            fVar105 = (1.0 - fVar105) * 0.0 + fVar105;
            fVar315 = fVar105;
          }
          else {
            fVar105 = INFINITY;
            if ((fVar104 == 0.0) && (fVar105 = INFINITY, !NAN(fVar104))) {
              fVar105 = 0.0;
            }
            fVar315 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar104 == 0.0) & 1) * 4);
          }
          if (fVar105 <= fVar224) {
            fVar224 = fVar105;
          }
          if (fVar315 <= fVar254) {
            fVar315 = fVar254;
          }
        }
        pRVar62 = (RTCIntersectArguments *)(ulong)(fVar126 < 0.0);
        fVar104 = *(float *)(&DAT_01ff1ecc + (long)pRVar62 * 4);
        if ((fVar226 != fVar104) || (fVar105 = fVar315, NAN(fVar226) || NAN(fVar104))) {
          if ((fVar126 != fVar125) || (NAN(fVar126) || NAN(fVar125))) {
            fVar126 = -fVar125 / (fVar126 - fVar125);
            fVar126 = (1.0 - fVar126) * 0.0 + fVar126;
            fVar105 = fVar126;
          }
          else {
            fVar126 = INFINITY;
            if ((fVar125 == 0.0) && (fVar126 = INFINITY, !NAN(fVar125))) {
              fVar126 = 0.0;
            }
            pRVar62 = (RTCIntersectArguments *)(ulong)(-(uint)(fVar125 == 0.0) & 1);
            fVar105 = *(float *)(&DAT_01ff1ec4 + (long)pRVar62 * 4);
          }
          if (fVar126 <= fVar224) {
            fVar224 = fVar126;
          }
          if (fVar105 <= fVar315) {
            fVar105 = fVar315;
          }
        }
        auVar326 = ZEXT816(0x3f80000000000000);
        if ((fVar257 != fVar104) || (NAN(fVar257) || NAN(fVar104))) {
          fVar224 = (float)(~-(uint)(fVar224 < 1.0) & 0x3f800000 |
                           (uint)fVar224 & -(uint)(fVar224 < 1.0));
          fVar105 = (float)(~-(uint)(fVar105 < 1.0) & (uint)fVar105 |
                           -(uint)(fVar105 < 1.0) & 0x3f800000);
        }
        uVar71 = -(uint)(fVar105 < auVar326._4_4_);
        fVar224 = (float)(~-(uint)(fVar224 < 0.0) & (uint)fVar224);
        fVar104 = (float)(~uVar71 & 0x3f800000 | (uint)fVar105 & uVar71);
        bVar21 = true;
        if (fVar224 <= fVar104) {
          fVar224 = fVar224 + -0.1;
          fVar104 = fVar104 + 0.1;
          uVar71 = -(uint)(fVar104 < auVar326._4_4_);
          fVar224 = (float)(~-(uint)(fVar224 < 0.0) & (uint)fVar224);
          fVar239 = (float)(~uVar71 & 0x3f800000 | (uint)fVar104 & uVar71);
          fVar254 = 1.0 - fVar224;
          fVar257 = 1.0 - fVar224;
          fVar315 = 1.0 - fVar239;
          fVar229 = 1.0 - fVar239;
          fVar104 = auVar99._0_4_ * fVar254 + auVar99._8_4_ * fVar224;
          fVar105 = auVar99._4_4_ * fVar257 + auVar99._12_4_ * fVar224;
          fVar125 = auVar99._0_4_ * fVar315 + auVar99._8_4_ * fVar239;
          fVar126 = auVar99._4_4_ * fVar229 + auVar99._12_4_ * fVar239;
          fVar226 = fVar171 * fVar254 + fVar200 * fVar224;
          fVar241 = fVar177 * fVar257 + fVar201 * fVar224;
          fVar171 = fVar171 * fVar315 + fVar200 * fVar239;
          fVar177 = fVar177 * fVar229 + fVar201 * fVar239;
          fVar200 = fVar202 * fVar254 + fVar213 * fVar224;
          fVar201 = fVar212 * fVar257 + fVar214 * fVar224;
          fVar202 = fVar202 * fVar315 + fVar213 * fVar239;
          fVar212 = fVar212 * fVar229 + fVar214 * fVar239;
          fVar213 = fVar254 * fVar143 + fVar163 * fVar224;
          fVar214 = fVar257 * fVar146 + fVar165 * fVar224;
          fVar143 = fVar315 * fVar143 + fStack_410 * fVar239;
          fVar146 = fVar229 * fVar146 + fStack_40c * fVar239;
          fVar309 = fVar168 * (1.0 - fVar224) + fVar172 * fVar224;
          fStack_40c = fVar168 * (1.0 - fVar239) + fVar172 * fVar239;
          fVar74 = 1.0 / fVar74;
          auVar121._0_4_ = fVar143 - fVar213;
          auVar121._4_4_ = fVar146 - fVar214;
          auVar121._8_4_ = fVar143 - fVar143;
          auVar121._12_4_ = fVar146 - fVar146;
          auVar157._0_8_ = CONCAT44(fVar212 - fVar201,fVar202 - fVar200);
          auVar157._8_4_ = fVar202 - fVar202;
          auVar157._12_4_ = fVar212 - fVar212;
          auVar272._0_4_ = fVar171 - fVar226;
          auVar272._4_4_ = fVar177 - fVar241;
          auVar272._8_4_ = fVar171 - fVar171;
          auVar272._12_4_ = fVar177 - fVar177;
          auVar222._0_8_ = CONCAT44((fVar241 - fVar105) * 3.0,(fVar226 - fVar104) * 3.0);
          auVar222._8_4_ = (fVar171 - fVar125) * 3.0;
          auVar222._12_4_ = (fVar177 - fVar126) * 3.0;
          auVar196._0_8_ = CONCAT44((fVar201 - fVar241) * 3.0,(fVar200 - fVar226) * 3.0);
          auVar196._8_4_ = (fVar202 - fVar171) * 3.0;
          auVar196._12_4_ = (fVar212 - fVar177) * 3.0;
          auVar251._0_4_ = (fVar213 - fVar200) * 3.0;
          auVar251._4_4_ = (fVar214 - fVar201) * 3.0;
          auVar251._8_4_ = (fVar143 - fVar202) * 3.0;
          auVar251._12_4_ = (fVar146 - fVar212) * 3.0;
          auVar204._8_4_ = auVar196._8_4_;
          auVar204._0_8_ = auVar196._0_8_;
          auVar204._12_4_ = auVar196._12_4_;
          auVar128 = minps(auVar204,auVar251);
          auVar75 = maxps(auVar196,auVar251);
          auVar234._8_4_ = auVar222._8_4_;
          auVar234._0_8_ = auVar222._0_8_;
          auVar234._12_4_ = auVar222._12_4_;
          auVar130 = minps(auVar234,auVar128);
          auVar119 = maxps(auVar222,auVar75);
          auVar29._4_8_ = auVar75._8_8_;
          auVar29._0_4_ = auVar130._4_4_;
          auVar197._0_8_ = auVar29._0_8_ << 0x20;
          auVar197._8_4_ = auVar130._8_4_;
          auVar197._12_4_ = auVar130._12_4_;
          auVar198._8_8_ = auVar130._8_8_;
          auVar198._0_8_ = auVar197._8_8_;
          auVar30._4_8_ = auVar128._8_8_;
          auVar30._0_4_ = auVar119._4_4_;
          auVar205._0_8_ = auVar30._0_8_ << 0x20;
          auVar205._8_4_ = auVar119._8_4_;
          auVar205._12_4_ = auVar119._12_4_;
          auVar206._8_8_ = auVar119._8_8_;
          auVar206._0_8_ = auVar205._8_8_;
          auVar128 = minps(auVar130,auVar198);
          auVar75 = maxps(auVar119,auVar206);
          fVar239 = auVar128._0_4_ * fVar74;
          fVar240 = auVar128._4_4_ * fVar74;
          fVar262 = auVar128._8_4_ * fVar74;
          fVar274 = auVar128._12_4_ * fVar74;
          fVar202 = fVar74 * auVar75._0_4_;
          fVar213 = fVar74 * auVar75._4_4_;
          fVar224 = fVar74 * auVar75._8_4_;
          fVar74 = fVar74 * auVar75._12_4_;
          fVar315 = 1.0 / (fStack_40c - fVar309);
          auVar141._0_8_ = CONCAT44(fVar126 - fVar105,fVar125 - fVar104);
          auVar141._8_4_ = fVar125 - fVar125;
          auVar141._12_4_ = fVar126 - fVar126;
          auVar207._8_4_ = auVar141._8_4_;
          auVar207._0_8_ = auVar141._0_8_;
          auVar207._12_4_ = auVar141._12_4_;
          auVar119 = minps(auVar207,auVar272);
          auVar128 = maxps(auVar141,auVar272);
          auVar100._8_4_ = auVar157._8_4_;
          auVar100._0_8_ = auVar157._0_8_;
          auVar100._12_4_ = auVar157._12_4_;
          auVar75 = minps(auVar100,auVar121);
          auVar119 = minps(auVar119,auVar75);
          auVar75 = maxps(auVar157,auVar121);
          auVar75 = maxps(auVar128,auVar75);
          fVar254 = auVar119._0_4_ * fVar315;
          fVar257 = auVar119._4_4_ * fVar315;
          fVar229 = fVar315 * auVar75._0_4_;
          fVar315 = fVar315 * auVar75._4_4_;
          local_428 = CONCAT44(fStack_40c,fVar309);
          auVar199._4_4_ = fStack_40c;
          auVar199._0_4_ = fVar165;
          auVar199._8_4_ = fVar124;
          auVar199._12_4_ = fVar103;
          fVar104 = (fVar163 + fVar165) * 0.5;
          fVar105 = (fVar309 + fStack_40c) * 0.5;
          fVar125 = (fVar165 + fVar124) * 0.0;
          fVar126 = (fStack_40c + fVar103) * 0.0;
          fVar143 = local_88 * fVar104 + local_308;
          fVar168 = fStack_84 * fVar104 + fStack_304;
          fVar146 = fStack_80 * fVar104 + fStack_300;
          fVar171 = fStack_7c * fVar104 + fStack_2fc;
          fVar172 = local_98 * fVar104 + (float)local_318._0_4_;
          fVar177 = fStack_94 * fVar104 + (float)local_318._4_4_;
          fVar200 = fStack_90 * fVar104 + fStack_310;
          fVar201 = fStack_8c * fVar104 + fStack_30c;
          fVar143 = (fVar172 - fVar143) * fVar104 + fVar143;
          fVar168 = (fVar177 - fVar168) * fVar104 + fVar168;
          fVar146 = (fVar200 - fVar146) * fVar104 + fVar146;
          fVar171 = (fVar201 - fVar171) * fVar104 + fVar171;
          fVar172 = (((local_a8 * fVar104 + (float)local_328) - fVar172) * fVar104 + fVar172) -
                    fVar143;
          fVar177 = (((fStack_a4 * fVar104 + local_328._4_4_) - fVar177) * fVar104 + fVar177) -
                    fVar168;
          fVar200 = (((fStack_a0 * fVar104 + (float)uStack_320) - fVar200) * fVar104 + fVar200) -
                    fVar146;
          fVar201 = (((fStack_9c * fVar104 + uStack_320._4_4_) - fVar201) * fVar104 + fVar201) -
                    fVar171;
          fVar143 = fVar104 * fVar172 + fVar143;
          fVar168 = fVar104 * fVar177 + fVar168;
          fVar172 = fVar172 * 3.0;
          fVar177 = fVar177 * 3.0;
          fVar146 = (fVar104 * fVar200 + fVar146) - fVar143;
          fVar171 = (fVar104 * fVar201 + fVar171) - fVar168;
          fVar172 = (fVar200 * 3.0 - fVar172) * fVar105 + fVar172;
          fVar177 = (fVar201 * 3.0 - fVar177) * fVar105 + fVar177;
          auVar122._0_8_ = CONCAT44(fVar172,fVar146) ^ 0x80000000;
          auVar122._8_4_ = fVar172;
          auVar122._12_4_ = fVar172;
          fVar278 = fVar163 - fVar104;
          fVar285 = fVar309 - fVar105;
          fVar294 = fVar165 - fVar125;
          fVar295 = fStack_40c - fVar126;
          fVar297 = fVar165 - fVar104;
          fVar299 = fStack_40c - fVar105;
          fVar124 = fVar124 - fVar125;
          fVar103 = fVar103 - fVar126;
          fVar143 = fVar146 * fVar105 + fVar143;
          fVar168 = fVar171 * fVar105 + fVar168;
          auVar142._0_8_ = CONCAT44(fVar177,fVar171) ^ 0x8000000000000000;
          auVar142._8_4_ = -fVar177;
          auVar142._12_4_ = -fVar177;
          auVar306._0_4_ = fVar171 * fVar172 - fVar177 * fVar146;
          auVar306._4_4_ = auVar306._0_4_;
          auVar306._8_4_ = auVar306._0_4_;
          auVar306._12_4_ = auVar306._0_4_;
          auVar128 = divps(auVar142,auVar306);
          auVar75 = divps(auVar122,auVar306);
          fVar172 = auVar128._0_4_;
          fVar177 = auVar128._4_4_;
          fVar146 = auVar75._0_4_;
          fVar171 = auVar75._4_4_;
          fVar104 = fVar104 - (fVar168 * fVar146 + fVar143 * fVar172);
          fVar125 = fVar105 - (fVar168 * fVar171 + fVar143 * fVar177);
          fVar126 = fVar105 - (fVar168 * auVar75._8_4_ + fVar143 * auVar128._8_4_);
          fVar105 = fVar105 - (fVar168 * auVar75._12_4_ + fVar143 * auVar128._12_4_);
          auVar327._0_8_ = CONCAT44(fVar177 * fVar254,fVar177 * fVar239);
          auVar327._8_4_ = fVar177 * fVar240;
          auVar327._12_4_ = fVar177 * fVar257;
          auVar252._0_4_ = fVar177 * fVar202;
          auVar252._4_4_ = fVar177 * fVar229;
          auVar252._8_4_ = fVar177 * fVar213;
          auVar252._12_4_ = fVar177 * fVar315;
          auVar333._8_4_ = auVar327._8_4_;
          auVar333._0_8_ = auVar327._0_8_;
          auVar333._12_4_ = auVar327._12_4_;
          auVar130 = minps(auVar333,auVar252);
          auVar128 = maxps(auVar252,auVar327);
          auVar158._0_8_ = CONCAT44(fVar171 * fVar257,fVar171 * fVar240);
          auVar158._8_4_ = fVar171 * fVar262;
          auVar158._12_4_ = fVar171 * fVar274;
          auVar328._0_4_ = fVar171 * fVar213;
          auVar328._4_4_ = fVar171 * fVar315;
          auVar328._8_4_ = fVar171 * fVar224;
          auVar328._12_4_ = fVar171 * fVar74;
          auVar235._8_4_ = auVar158._8_4_;
          auVar235._0_8_ = auVar158._0_8_;
          auVar235._12_4_ = auVar158._12_4_;
          auVar75 = minps(auVar235,auVar328);
          auVar119 = maxps(auVar328,auVar158);
          fVar143 = 0.0 - (auVar119._0_4_ + auVar128._0_4_);
          fVar168 = 1.0 - (auVar119._4_4_ + auVar128._4_4_);
          fVar200 = 0.0 - (auVar119._8_4_ + auVar128._8_4_);
          fVar201 = 0.0 - (auVar119._12_4_ + auVar128._12_4_);
          fVar212 = 0.0 - (auVar75._0_4_ + auVar130._0_4_);
          fVar214 = 1.0 - (auVar75._4_4_ + auVar130._4_4_);
          fVar226 = 0.0 - (auVar75._8_4_ + auVar130._8_4_);
          fVar241 = 0.0 - (auVar75._12_4_ + auVar130._12_4_);
          auVar253._0_8_ = CONCAT44(fVar285 * fVar168,fVar278 * fVar143);
          auVar253._8_4_ = fVar294 * fVar200;
          auVar253._12_4_ = fVar295 * fVar201;
          auVar307._0_8_ = CONCAT44(fVar254 * fVar172,fVar239 * fVar172);
          auVar307._8_4_ = fVar240 * fVar172;
          auVar307._12_4_ = fVar257 * fVar172;
          auVar236._0_4_ = fVar172 * fVar202;
          auVar236._4_4_ = fVar172 * fVar229;
          auVar236._8_4_ = fVar172 * fVar213;
          auVar236._12_4_ = fVar172 * fVar315;
          auVar318._8_4_ = auVar307._8_4_;
          auVar318._0_8_ = auVar307._0_8_;
          auVar318._12_4_ = auVar307._12_4_;
          auVar128 = minps(auVar318,auVar236);
          auVar75 = maxps(auVar236,auVar307);
          auVar208._0_8_ = CONCAT44(fVar257 * fVar146,fVar240 * fVar146);
          auVar208._8_4_ = fVar262 * fVar146;
          auVar208._12_4_ = fVar274 * fVar146;
          auVar329._0_4_ = fVar146 * fVar213;
          auVar329._4_4_ = fVar146 * fVar315;
          auVar329._8_4_ = fVar146 * fVar224;
          auVar329._12_4_ = fVar146 * fVar74;
          auVar334._8_4_ = auVar208._8_4_;
          auVar334._0_8_ = auVar208._0_8_;
          auVar334._12_4_ = auVar208._12_4_;
          auVar130 = minps(auVar334,auVar329);
          auVar308._0_4_ = fVar278 * fVar212;
          auVar308._4_4_ = fVar285 * fVar214;
          auVar308._8_4_ = fVar294 * fVar226;
          auVar308._12_4_ = fVar295 * fVar241;
          auVar159._0_8_ = CONCAT44(fVar168 * fVar299,fVar143 * fVar297);
          auVar159._8_4_ = fVar200 * fVar124;
          auVar159._12_4_ = fVar201 * fVar103;
          auVar170._0_4_ = fVar212 * fVar297;
          auVar170._4_4_ = fVar214 * fVar299;
          auVar170._8_4_ = fVar226 * fVar124;
          auVar170._12_4_ = fVar241 * fVar103;
          auVar119 = maxps(auVar329,auVar208);
          auVar326._0_4_ = auVar119._0_4_ + auVar75._0_4_;
          auVar326._4_4_ = auVar119._4_4_ + auVar75._4_4_;
          auVar326._8_4_ = auVar119._8_4_ + auVar75._8_4_;
          auVar326._12_4_ = auVar119._12_4_ + auVar75._12_4_;
          fVar74 = 1.0 - (auVar130._0_4_ + auVar128._0_4_);
          fVar143 = 0.0 - (auVar130._4_4_ + auVar128._4_4_);
          fVar168 = 0.0 - (auVar130._8_4_ + auVar128._8_4_);
          fVar200 = 0.0 - (auVar130._12_4_ + auVar128._12_4_);
          auVar237._0_8_ =
               CONCAT44(fVar285 * (0.0 - auVar326._4_4_),fVar278 * (1.0 - auVar326._0_4_));
          auVar237._8_4_ = fVar294 * (0.0 - auVar326._8_4_);
          auVar237._12_4_ = fVar295 * (0.0 - auVar326._12_4_);
          auVar273._0_4_ = fVar278 * fVar74;
          auVar273._4_4_ = fVar285 * fVar143;
          auVar273._8_4_ = fVar294 * fVar168;
          auVar273._12_4_ = fVar295 * fVar200;
          auVar209._0_8_ =
               CONCAT44((0.0 - auVar326._4_4_) * fVar299,(1.0 - auVar326._0_4_) * fVar297);
          auVar209._8_4_ = (0.0 - auVar326._8_4_) * fVar124;
          auVar209._12_4_ = (0.0 - auVar326._12_4_) * fVar103;
          auVar223._0_4_ = fVar74 * fVar297;
          auVar223._4_4_ = fVar143 * fVar299;
          auVar223._8_4_ = fVar168 * fVar124;
          auVar223._12_4_ = fVar200 * fVar103;
          auVar293._8_4_ = auVar237._8_4_;
          auVar293._0_8_ = auVar237._0_8_;
          auVar293._12_4_ = auVar237._12_4_;
          auVar75 = minps(auVar293,auVar273);
          auVar319._8_4_ = auVar209._8_4_;
          auVar319._0_8_ = auVar209._0_8_;
          auVar319._12_4_ = auVar209._12_4_;
          auVar128 = minps(auVar319,auVar223);
          auVar130 = minps(auVar75,auVar128);
          auVar128 = maxps(auVar273,auVar237);
          auVar75 = maxps(auVar223,auVar209);
          auVar119 = maxps(auVar75,auVar128);
          auVar210._8_4_ = auVar253._8_4_;
          auVar210._0_8_ = auVar253._0_8_;
          auVar210._12_4_ = auVar253._12_4_;
          auVar75 = minps(auVar210,auVar308);
          auVar238._8_4_ = auVar159._8_4_;
          auVar238._0_8_ = auVar159._0_8_;
          auVar238._12_4_ = auVar159._12_4_;
          auVar128 = minps(auVar238,auVar170);
          auVar128 = minps(auVar75,auVar128);
          auVar324 = maxps(auVar308,auVar253);
          auVar75 = maxps(auVar170,auVar159);
          auVar75 = maxps(auVar75,auVar324);
          auVar211._0_4_ = auVar130._4_4_ + auVar130._0_4_ + fVar104;
          auVar211._4_4_ = auVar128._4_4_ + auVar128._0_4_ + fVar125;
          auVar211._8_4_ = auVar130._8_4_ + auVar130._4_4_ + fVar126;
          auVar211._12_4_ = auVar130._12_4_ + auVar128._4_4_ + fVar105;
          fVar74 = auVar119._4_4_ + auVar119._0_4_ + fVar104;
          fVar103 = auVar75._4_4_ + auVar75._0_4_ + fVar125;
          auVar160._4_4_ = fVar103;
          auVar160._0_4_ = fVar74;
          auVar32._4_4_ = fVar309;
          auVar32._0_4_ = fVar163;
          auVar32._8_4_ = fVar165;
          auVar32._12_4_ = fStack_40c;
          auVar128 = maxps(auVar32,auVar211);
          auVar160._8_4_ = auVar119._8_4_ + auVar119._4_4_ + fVar126;
          auVar160._12_4_ = auVar119._12_4_ + auVar75._4_4_ + fVar105;
          auVar75 = minps(auVar160,auVar199);
          iVar61 = -(uint)(auVar75._0_4_ < auVar128._0_4_);
          iVar70 = -(uint)(auVar75._4_4_ < auVar128._4_4_);
          auVar162._4_4_ = iVar70;
          auVar162._0_4_ = iVar61;
          auVar162._8_4_ = iVar70;
          auVar162._12_4_ = iVar70;
          auVar161._8_8_ = auVar162._8_8_;
          auVar161._4_4_ = iVar61;
          auVar161._0_4_ = iVar61;
          uVar71 = movmskpd((int)pRVar62,auVar161);
          pRVar62 = (RTCIntersectArguments *)(ulong)uVar71;
          fStack_410 = fVar165;
          if (uVar71 == 0) {
            pRVar62 = (RTCIntersectArguments *)0x0;
            if (auVar211._0_4_ <= fVar163) {
              auVar326._0_12_ = ZEXT812(0x40400000);
              auVar326._12_4_ = 0.0;
              auVar335._4_4_ = fStack_304;
              auVar335._0_4_ = local_308;
              auVar335._8_4_ = fStack_300;
              auVar335._12_4_ = fStack_2fc;
            }
            else {
              auVar326._0_12_ = ZEXT812(0x40400000);
              auVar326._12_4_ = 0.0;
              auVar335._4_4_ = fStack_304;
              auVar335._0_4_ = local_308;
              auVar335._8_4_ = fStack_300;
              auVar335._12_4_ = fStack_2fc;
              if (fVar74 < fVar165) {
                iVar61 = -(uint)(fVar103 < fStack_40c);
                pRVar62 = (RTCIntersectArguments *)
                          (ulong)CONCAT11((char)((uint)iVar61 >> 8),
                                          (byte)iVar61 & fVar309 < auVar211._4_4_);
              }
            }
            bVar56 = bVar67 | (byte)pRVar62;
            if (bVar56 == 1) {
              paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)&DAT_000000c8;
              do {
                fVar103 = 1.0 - fVar104;
                fVar126 = fVar104 * fVar104 * fVar104;
                fVar163 = auVar326._0_4_;
                fVar124 = fVar104 * fVar104 * fVar163 * fVar103;
                fVar74 = fVar103 * fVar103 * fVar103;
                fVar143 = fVar104 * fVar163 * fVar103 * fVar103;
                fVar103 = fVar74 * auVar335._0_4_ +
                          fVar143 * (float)local_318._0_4_ +
                          fVar124 * (float)local_328 + fVar126 * (float)local_b8._0_4_;
                fVar105 = fVar74 * auVar335._4_4_ +
                          fVar143 * (float)local_318._4_4_ +
                          fVar124 * local_328._4_4_ + fVar126 * (float)local_b8._4_4_;
                fVar103 = ((fVar74 * auVar335._8_4_ +
                           fVar143 * fStack_310 + fVar124 * (float)uStack_320 + fVar126 * fStack_b0)
                          - fVar103) * fVar125 + fVar103;
                fVar105 = ((fVar74 * auVar335._12_4_ +
                           fVar143 * fStack_30c + fVar124 * uStack_320._4_4_ + fVar126 * fStack_ac)
                          - fVar105) * fVar125 + fVar105;
                fVar104 = fVar104 - (fVar105 * fVar146 + fVar103 * fVar172);
                fVar125 = fVar125 - (fVar105 * fVar171 + fVar103 * fVar177);
                fVar74 = ABS(fVar105);
                if (ABS(fVar105) <= ABS(fVar103)) {
                  fVar74 = ABS(fVar103);
                }
                if (fVar74 < fVar144) {
                  if ((((0.0 <= fVar104) && (fVar104 <= 1.0)) && (0.0 <= fVar125)) &&
                     (fVar125 <= 1.0)) {
                    fVar74 = (pre->ray_space).vx.field_0.m128[2];
                    fVar103 = (pre->ray_space).vy.field_0.m128[2];
                    fVar105 = (pre->ray_space).vz.field_0.m128[2];
                    fVar124 = (ray->super_RayK<1>).org.field_0.m128[0];
                    fVar126 = (ray->super_RayK<1>).org.field_0.m128[1];
                    fVar143 = (ray->super_RayK<1>).org.field_0.m128[2];
                    fVar172 = 1.0 - fVar125;
                    fVar171 = 1.0 - fVar104;
                    fVar146 = fVar171 * fVar171 * fVar171;
                    fVar165 = fVar104 * fVar163 * fVar171 * fVar171;
                    fVar168 = fVar104 * fVar104 * fVar104;
                    fVar163 = fVar104 * fVar104 * fVar163 * fVar171;
                    fVar74 = (((fStack_370 - fVar143) * fVar105 +
                              (fStack_374 - fVar126) * fVar103 + (local_378 - fVar124) * fVar74) *
                              fVar172 +
                             ((fStack_360 - fVar143) * fVar105 +
                             (fStack_364 - fVar126) * fVar103 + (local_368 - fVar124) * fVar74) *
                             fVar125) * fVar146 +
                             (((fStack_380 - fVar143) * fVar105 +
                              (fStack_384 - fVar126) * fVar103 + (local_388 - fVar124) * fVar74) *
                              fVar172 +
                             ((fStack_350 - fVar143) * fVar105 +
                             (fStack_354 - fVar126) * fVar103 + (local_358 - fVar124) * fVar74) *
                             fVar125) * fVar165 +
                             (((fStack_3a0 - fVar143) * fVar105 +
                              (fStack_3a4 - fVar126) * fVar103 + (local_3a8 - fVar124) * fVar74) *
                              fVar172 +
                             ((local_3cc.m128[3] - fVar143) * fVar105 +
                             (local_3cc.m128[2] - fVar126) * fVar103 +
                             (local_3cc.m128[1] - fVar124) * fVar74) * fVar125) * fVar163 +
                             (fVar172 * ((fStack_390 - fVar143) * fVar105 +
                                        (fStack_394 - fVar126) * fVar103 +
                                        (local_398 - fVar124) * fVar74) +
                             ((fStack_2b0 - fVar143) * fVar105 +
                             (fStack_2b4 - fVar126) * fVar103 + (local_2b8 - fVar124) * fVar74) *
                             fVar125) * fVar168;
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar74) &&
                       (fVar103 = (ray->super_RayK<1>).tfar, fVar74 <= fVar103)) {
                      fVar143 = 1.0 - fVar125;
                      fVar172 = 1.0 - fVar125;
                      fVar177 = 1.0 - fVar125;
                      fVar105 = local_388 * fVar143 + local_358 * fVar125;
                      fVar124 = fStack_384 * fVar172 + fStack_354 * fVar125;
                      fVar126 = fStack_380 * fVar177 + fStack_350 * fVar125;
                      fVar200 = local_3a8 * fVar143 + local_3cc.m128[1] * fVar125;
                      fVar202 = fStack_3a4 * fVar172 + local_3cc.m128[2] * fVar125;
                      fVar213 = fStack_3a0 * fVar177 + local_3cc.m128[3] * fVar125;
                      fVar201 = fVar200 - fVar105;
                      fVar212 = fVar202 - fVar124;
                      fVar214 = fVar213 - fVar126;
                      fVar105 = (((fVar105 - (local_378 * fVar143 + local_368 * fVar125)) * fVar171
                                 + fVar104 * fVar201) * fVar171 +
                                (fVar201 * fVar171 +
                                ((fVar143 * local_398 + fVar125 * local_2b8) - fVar200) * fVar104) *
                                fVar104) * 3.0;
                      fVar124 = (((fVar124 - (fStack_374 * fVar172 + fStack_364 * fVar125)) *
                                  fVar171 + fVar104 * fVar212) * fVar171 +
                                (fVar212 * fVar171 +
                                ((fVar172 * fStack_394 + fVar125 * fStack_2b4) - fVar202) * fVar104)
                                * fVar104) * 3.0;
                      fVar126 = (((fVar126 - (fStack_370 * fVar177 + fStack_360 * fVar125)) *
                                  fVar171 + fVar104 * fVar214) * fVar171 +
                                (fVar214 * fVar171 +
                                ((fVar177 * fStack_390 + fVar125 * fStack_2b0) - fVar213) * fVar104)
                                * fVar104) * 3.0;
                      pGVar15 = (context->scene->geometries).items[uVar69].ptr;
                      uVar71 = (ray->super_RayK<1>).mask;
                      paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar71;
                      pRVar62 = (RTCIntersectArguments *)context;
                      if ((pGVar15->mask & uVar71) != 0) {
                        fVar171 = fVar146 * local_178 +
                                  fVar165 * local_188 + fVar163 * local_198 + fVar168 * local_1a8;
                        fVar172 = fVar146 * fStack_174 +
                                  fVar165 * fStack_184 + fVar163 * fStack_194 + fVar168 * fStack_1a4
                        ;
                        fVar146 = fVar146 * fStack_170 +
                                  fVar165 * fStack_180 + fVar163 * fStack_190 + fVar168 * fStack_1a0
                        ;
                        fVar143 = fVar172 * fVar105 - fVar124 * fVar171;
                        fVar124 = fVar146 * fVar124 - fVar126 * fVar172;
                        fVar105 = fVar171 * fVar126 - fVar105 * fVar146;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          (ray->super_RayK<1>).tfar = fVar74;
                          *(ulong *)&(ray->Ng).field_0 = CONCAT44(fVar105,fVar124);
                          (ray->Ng).field_0.field_0.z = fVar143;
                          ray->u = fVar104;
                          ray->v = fVar125;
                          ray->primID = (uint)local_340;
                          ray->geomID = uVar69;
                          ray->instID[0] = context->user->instID[0];
                          uVar71 = context->user->instPrimID[0];
                          ray->instPrimID[0] = uVar71;
                          paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar71;
                        }
                        else {
                          local_1e8 = CONCAT44(fVar105,fVar124);
                          local_1e0 = fVar143;
                          local_1dc = fVar104;
                          fStack_1d8 = fVar125;
                          local_1d4 = (uint)local_340;
                          local_1d0 = uVar69;
                          local_1cc = context->user->instID[0];
                          pRVar62 = (RTCIntersectArguments *)(ulong)local_1cc;
                          local_1c8 = context->user->instPrimID[0];
                          (ray->super_RayK<1>).tfar = fVar74;
                          local_3cc.m128[0] = -NAN;
                          local_2e8.valid = (int *)&local_3cc;
                          local_2e8.geometryUserPtr = pGVar15->userPtr;
                          local_2e8.context = context->user;
                          local_2e8.ray = (RTCRayN *)ray;
                          local_2e8.hit = (RTCHitN *)&local_1e8;
                          local_2e8.N = 1;
                          if (pGVar15->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00bf1446:
                            pRVar62 = context->args;
                            if ((RTCIntersectArguments *)pRVar62->filter !=
                                (RTCIntersectArguments *)0x0) {
                              if ((((ulong)*(Scene **)&pRVar62->flags & 2) != 0) ||
                                 (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                                (*(code *)pRVar62->filter)(&local_2e8);
                              }
                              if (*(float *)local_2e8.valid == 0.0) goto LAB_00bf14e3;
                            }
                            *(float *)((long)local_2e8.ray + 0x30) = *(float *)local_2e8.hit;
                            *(float *)((long)local_2e8.ray + 0x34) = *(float *)(local_2e8.hit + 4);
                            *(float *)((long)local_2e8.ray + 0x38) = *(float *)(local_2e8.hit + 8);
                            *(float *)((long)local_2e8.ray + 0x3c) = *(float *)(local_2e8.hit + 0xc)
                            ;
                            *(float *)((long)local_2e8.ray + 0x40) =
                                 *(float *)(local_2e8.hit + 0x10);
                            *(float *)((long)local_2e8.ray + 0x44) =
                                 *(float *)(local_2e8.hit + 0x14);
                            *(float *)((long)local_2e8.ray + 0x48) =
                                 *(float *)(local_2e8.hit + 0x18);
                            *(float *)((long)local_2e8.ray + 0x4c) =
                                 *(float *)(local_2e8.hit + 0x1c);
                            pRVar62 = (RTCIntersectArguments *)
                                      (ulong)(uint)*(float *)(local_2e8.hit + 0x20);
                            *(float *)((long)local_2e8.ray + 0x50) =
                                 *(float *)(local_2e8.hit + 0x20);
                            paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2e8.ray;
                          }
                          else {
                            uStack_3b0 = auVar99._8_8_;
                            local_3b8 = auVar65;
                            (*pGVar15->intersectionFilterN)(&local_2e8);
                            auVar65 = local_3b8;
                            if (*(float *)local_2e8.valid != 0.0) goto LAB_00bf1446;
LAB_00bf14e3:
                            (ray->super_RayK<1>).tfar = fVar103;
                            paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_2e8.valid;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)((long)paVar59 + -1);
              } while (paVar59 != (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0);
            }
            else {
              bVar21 = false;
              paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar28,bVar56);
            }
          }
        }
      }
    } while (bVar21);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }